

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx::CurveNiIntersectorK<8,4>::
     occluded_hn<embree::avx::OrientedCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  float *pfVar2;
  float *pfVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Primitive PVar10;
  Geometry *pGVar11;
  long lVar12;
  __int_type_conflict _Var13;
  RTCFilterFunctionN p_Var14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  bool bVar64;
  uint uVar65;
  ulong uVar66;
  uint uVar67;
  ulong uVar68;
  uint uVar69;
  uint uVar70;
  long lVar71;
  LinearSpace3fa *pLVar72;
  bool bVar73;
  undefined1 auVar74 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar75 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar105 [16];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  float t1;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  float fVar168;
  float fVar188;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  float fVar186;
  float fVar187;
  float fVar189;
  float fVar190;
  float fVar191;
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  float fVar192;
  float fVar211;
  float fVar212;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  float fVar214;
  float fVar215;
  float fVar216;
  undefined1 auVar207 [32];
  float fVar213;
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  float fVar217;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  float fVar231;
  float fVar232;
  float fVar234;
  float fVar236;
  float fVar237;
  undefined1 auVar228 [32];
  float fVar233;
  undefined1 auVar229 [32];
  undefined1 auVar235 [16];
  vfloat4 b0;
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [32];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [64];
  float fVar286;
  float fVar287;
  vfloat4 a0_1;
  float fVar288;
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [64];
  float fVar289;
  float fVar298;
  float fVar299;
  __m128 a;
  float fVar300;
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  float fVar301;
  float fVar307;
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  float fVar305;
  float fVar306;
  float fVar308;
  float fVar309;
  float fVar310;
  float in_register_0000151c;
  undefined1 auVar304 [32];
  float fVar311;
  float fVar312;
  float fVar320;
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  float fVar318;
  float fVar319;
  undefined1 auVar317 [32];
  float fVar321;
  float fVar322;
  float fVar331;
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  float fVar329;
  float fVar330;
  float in_register_0000159c;
  undefined1 auVar327 [32];
  float fVar333;
  vfloat4 a0;
  undefined1 auVar332 [16];
  float in_register_000015dc;
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_5a8 [8];
  float fStack_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float local_568;
  float fStack_564;
  float fStack_560;
  float fStack_55c;
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  undefined1 local_538 [8];
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  float fStack_520;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float local_4c8;
  float fStack_4c4;
  float fStack_4c0;
  float fStack_4bc;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  undefined1 local_4a8 [16];
  undefined1 (*local_498) [16];
  LinearSpace3fa *local_490;
  undefined1 local_488 [8];
  float fStack_480;
  float fStack_47c;
  undefined1 local_478 [8];
  float fStack_470;
  float fStack_46c;
  undefined1 local_468 [8];
  float fStack_460;
  float fStack_45c;
  undefined1 local_458 [8];
  float fStack_450;
  float fStack_44c;
  undefined1 local_448 [8];
  float fStack_440;
  float fStack_43c;
  undefined1 local_438 [8];
  float fStack_430;
  float fStack_42c;
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [16];
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  undefined1 local_3f8 [8];
  float fStack_3f0;
  float fStack_3ec;
  undefined1 auStack_3e8 [16];
  uint auStack_3d8 [4];
  RTCFilterFunctionNArguments local_3c8;
  undefined1 local_398 [8];
  float fStack_390;
  float fStack_38c;
  undefined1 local_388 [8];
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [8];
  float fStack_370;
  float fStack_36c;
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [8];
  float fStack_330;
  float fStack_32c;
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [8];
  float fStack_290;
  float fStack_28c;
  undefined1 local_288 [8];
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [32];
  float afStack_248 [8];
  RTCHitN local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  uint local_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  uint uStack_1a0;
  uint uStack_19c;
  undefined1 local_198 [32];
  undefined1 local_178 [32];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  undefined1 auVar230 [32];
  undefined1 auVar328 [32];
  
  PVar10 = prim[1];
  uVar66 = (ulong)(byte)PVar10;
  lVar71 = uVar66 * 5;
  auVar79 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar79 = vinsertps_avx(auVar79,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar23 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar23 = vinsertps_avx(auVar23,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar192 = *(float *)(prim + uVar66 * 0x19 + 0x12);
  auVar79 = vsubps_avx(auVar79,*(undefined1 (*) [16])(prim + uVar66 * 0x19 + 6));
  auVar100._0_4_ = fVar192 * auVar79._0_4_;
  auVar100._4_4_ = fVar192 * auVar79._4_4_;
  auVar100._8_4_ = fVar192 * auVar79._8_4_;
  auVar100._12_4_ = fVar192 * auVar79._12_4_;
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 4 + 6)));
  auVar150 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 4 + 10)));
  auVar193._0_4_ = fVar192 * auVar23._0_4_;
  auVar193._4_4_ = fVar192 * auVar23._4_4_;
  auVar193._8_4_ = fVar192 * auVar23._8_4_;
  auVar193._12_4_ = fVar192 * auVar23._12_4_;
  auVar90._16_16_ = auVar150;
  auVar90._0_16_ = auVar79;
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar71 + 6)));
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar71 + 10)));
  auVar153._16_16_ = auVar23;
  auVar153._0_16_ = auVar79;
  auVar15 = vcvtdq2ps_avx(auVar153);
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 6 + 6)));
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 6 + 10)));
  auVar163._16_16_ = auVar23;
  auVar163._0_16_ = auVar79;
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0xb + 6)));
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0xb + 10)));
  auVar16 = vcvtdq2ps_avx(auVar163);
  auVar164._16_16_ = auVar23;
  auVar164._0_16_ = auVar79;
  auVar17 = vcvtdq2ps_avx(auVar164);
  uVar68 = (ulong)((uint)(byte)PVar10 * 0xc);
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 + 6)));
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 + 10)));
  auVar228._16_16_ = auVar23;
  auVar228._0_16_ = auVar79;
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 + uVar66 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar228);
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 + uVar66 + 10)));
  auVar245._16_16_ = auVar23;
  auVar245._0_16_ = auVar79;
  lVar1 = uVar66 * 9;
  uVar68 = (ulong)(uint)((int)lVar1 * 2);
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 + 6)));
  auVar19 = vcvtdq2ps_avx(auVar245);
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 + 10)));
  auVar246._16_16_ = auVar23;
  auVar246._0_16_ = auVar79;
  auVar20 = vcvtdq2ps_avx(auVar246);
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 + uVar66 + 6)));
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 + uVar66 + 10)));
  auVar274._16_16_ = auVar23;
  auVar274._0_16_ = auVar79;
  uVar68 = (ulong)(uint)((int)lVar71 << 2);
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 + 6)));
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 + 10)));
  auVar21 = vcvtdq2ps_avx(auVar274);
  auVar282._16_16_ = auVar23;
  auVar282._0_16_ = auVar79;
  auVar22 = vcvtdq2ps_avx(auVar282);
  auVar79 = vshufps_avx(auVar193,auVar193,0);
  auVar23 = vshufps_avx(auVar193,auVar193,0x55);
  auVar150 = vshufps_avx(auVar193,auVar193,0xaa);
  fVar192 = auVar150._0_4_;
  fVar217 = auVar150._4_4_;
  fVar211 = auVar150._8_4_;
  fVar231 = auVar150._12_4_;
  fVar212 = auVar23._0_4_;
  fVar232 = auVar23._4_4_;
  fVar213 = auVar23._8_4_;
  fVar233 = auVar23._12_4_;
  fVar214 = auVar79._0_4_;
  fVar234 = auVar79._4_4_;
  fVar215 = auVar79._8_4_;
  fVar236 = auVar79._12_4_;
  auVar304._0_4_ = fVar214 * auVar90._0_4_ + fVar212 * auVar15._0_4_ + fVar192 * auVar16._0_4_;
  auVar304._4_4_ = fVar234 * auVar90._4_4_ + fVar232 * auVar15._4_4_ + fVar217 * auVar16._4_4_;
  auVar304._8_4_ = fVar215 * auVar90._8_4_ + fVar213 * auVar15._8_4_ + fVar211 * auVar16._8_4_;
  auVar304._12_4_ = fVar236 * auVar90._12_4_ + fVar233 * auVar15._12_4_ + fVar231 * auVar16._12_4_;
  auVar304._16_4_ = fVar214 * auVar90._16_4_ + fVar212 * auVar15._16_4_ + fVar192 * auVar16._16_4_;
  auVar304._20_4_ = fVar234 * auVar90._20_4_ + fVar232 * auVar15._20_4_ + fVar217 * auVar16._20_4_;
  auVar304._24_4_ = fVar215 * auVar90._24_4_ + fVar213 * auVar15._24_4_ + fVar211 * auVar16._24_4_;
  auVar304._28_4_ = fVar233 + in_register_000015dc + in_register_0000151c;
  auVar295._0_4_ = fVar214 * auVar17._0_4_ + fVar212 * auVar18._0_4_ + auVar19._0_4_ * fVar192;
  auVar295._4_4_ = fVar234 * auVar17._4_4_ + fVar232 * auVar18._4_4_ + auVar19._4_4_ * fVar217;
  auVar295._8_4_ = fVar215 * auVar17._8_4_ + fVar213 * auVar18._8_4_ + auVar19._8_4_ * fVar211;
  auVar295._12_4_ = fVar236 * auVar17._12_4_ + fVar233 * auVar18._12_4_ + auVar19._12_4_ * fVar231;
  auVar295._16_4_ = fVar214 * auVar17._16_4_ + fVar212 * auVar18._16_4_ + auVar19._16_4_ * fVar192;
  auVar295._20_4_ = fVar234 * auVar17._20_4_ + fVar232 * auVar18._20_4_ + auVar19._20_4_ * fVar217;
  auVar295._24_4_ = fVar215 * auVar17._24_4_ + fVar213 * auVar18._24_4_ + auVar19._24_4_ * fVar211;
  auVar295._28_4_ = fVar233 + in_register_000015dc + in_register_0000159c;
  auVar207._0_4_ = fVar214 * auVar20._0_4_ + fVar212 * auVar21._0_4_ + auVar22._0_4_ * fVar192;
  auVar207._4_4_ = fVar234 * auVar20._4_4_ + fVar232 * auVar21._4_4_ + auVar22._4_4_ * fVar217;
  auVar207._8_4_ = fVar215 * auVar20._8_4_ + fVar213 * auVar21._8_4_ + auVar22._8_4_ * fVar211;
  auVar207._12_4_ = fVar236 * auVar20._12_4_ + fVar233 * auVar21._12_4_ + auVar22._12_4_ * fVar231;
  auVar207._16_4_ = fVar214 * auVar20._16_4_ + fVar212 * auVar21._16_4_ + auVar22._16_4_ * fVar192;
  auVar207._20_4_ = fVar234 * auVar20._20_4_ + fVar232 * auVar21._20_4_ + auVar22._20_4_ * fVar217;
  auVar207._24_4_ = fVar215 * auVar20._24_4_ + fVar213 * auVar21._24_4_ + auVar22._24_4_ * fVar211;
  auVar207._28_4_ = fVar236 + fVar233 + fVar231;
  auVar79 = vshufps_avx(auVar100,auVar100,0);
  auVar23 = vshufps_avx(auVar100,auVar100,0x55);
  auVar150 = vshufps_avx(auVar100,auVar100,0xaa);
  fVar217 = auVar150._0_4_;
  fVar211 = auVar150._4_4_;
  fVar231 = auVar150._8_4_;
  fVar212 = auVar150._12_4_;
  fVar234 = auVar23._0_4_;
  fVar215 = auVar23._4_4_;
  fVar236 = auVar23._8_4_;
  fVar216 = auVar23._12_4_;
  fVar232 = auVar79._0_4_;
  fVar213 = auVar79._4_4_;
  fVar233 = auVar79._8_4_;
  fVar214 = auVar79._12_4_;
  fVar192 = auVar90._28_4_;
  auVar124._0_4_ = fVar232 * auVar90._0_4_ + fVar234 * auVar15._0_4_ + fVar217 * auVar16._0_4_;
  auVar124._4_4_ = fVar213 * auVar90._4_4_ + fVar215 * auVar15._4_4_ + fVar211 * auVar16._4_4_;
  auVar124._8_4_ = fVar233 * auVar90._8_4_ + fVar236 * auVar15._8_4_ + fVar231 * auVar16._8_4_;
  auVar124._12_4_ = fVar214 * auVar90._12_4_ + fVar216 * auVar15._12_4_ + fVar212 * auVar16._12_4_;
  auVar124._16_4_ = fVar232 * auVar90._16_4_ + fVar234 * auVar15._16_4_ + fVar217 * auVar16._16_4_;
  auVar124._20_4_ = fVar213 * auVar90._20_4_ + fVar215 * auVar15._20_4_ + fVar211 * auVar16._20_4_;
  auVar124._24_4_ = fVar233 * auVar90._24_4_ + fVar236 * auVar15._24_4_ + fVar231 * auVar16._24_4_;
  auVar124._28_4_ = fVar192 + auVar15._28_4_ + auVar16._28_4_;
  auVar154._0_4_ = fVar232 * auVar17._0_4_ + auVar19._0_4_ * fVar217 + fVar234 * auVar18._0_4_;
  auVar154._4_4_ = fVar213 * auVar17._4_4_ + auVar19._4_4_ * fVar211 + fVar215 * auVar18._4_4_;
  auVar154._8_4_ = fVar233 * auVar17._8_4_ + auVar19._8_4_ * fVar231 + fVar236 * auVar18._8_4_;
  auVar154._12_4_ = fVar214 * auVar17._12_4_ + auVar19._12_4_ * fVar212 + fVar216 * auVar18._12_4_;
  auVar154._16_4_ = fVar232 * auVar17._16_4_ + auVar19._16_4_ * fVar217 + fVar234 * auVar18._16_4_;
  auVar154._20_4_ = fVar213 * auVar17._20_4_ + auVar19._20_4_ * fVar211 + fVar215 * auVar18._20_4_;
  auVar154._24_4_ = fVar233 * auVar17._24_4_ + auVar19._24_4_ * fVar231 + fVar236 * auVar18._24_4_;
  auVar154._28_4_ = fVar192 + auVar19._28_4_ + auVar16._28_4_;
  auVar165._8_4_ = 0x7fffffff;
  auVar165._0_8_ = 0x7fffffff7fffffff;
  auVar165._12_4_ = 0x7fffffff;
  auVar165._16_4_ = 0x7fffffff;
  auVar165._20_4_ = 0x7fffffff;
  auVar165._24_4_ = 0x7fffffff;
  auVar165._28_4_ = 0x7fffffff;
  auVar183._8_4_ = 0x219392ef;
  auVar183._0_8_ = 0x219392ef219392ef;
  auVar183._12_4_ = 0x219392ef;
  auVar183._16_4_ = 0x219392ef;
  auVar183._20_4_ = 0x219392ef;
  auVar183._24_4_ = 0x219392ef;
  auVar183._28_4_ = 0x219392ef;
  auVar90 = vandps_avx(auVar304,auVar165);
  auVar90 = vcmpps_avx(auVar90,auVar183,1);
  auVar15 = vblendvps_avx(auVar304,auVar183,auVar90);
  auVar90 = vandps_avx(auVar295,auVar165);
  auVar90 = vcmpps_avx(auVar90,auVar183,1);
  auVar16 = vblendvps_avx(auVar295,auVar183,auVar90);
  auVar90 = vandps_avx(auVar207,auVar165);
  auVar90 = vcmpps_avx(auVar90,auVar183,1);
  auVar90 = vblendvps_avx(auVar207,auVar183,auVar90);
  auVar166._0_4_ = fVar232 * auVar20._0_4_ + fVar234 * auVar21._0_4_ + auVar22._0_4_ * fVar217;
  auVar166._4_4_ = fVar213 * auVar20._4_4_ + fVar215 * auVar21._4_4_ + auVar22._4_4_ * fVar211;
  auVar166._8_4_ = fVar233 * auVar20._8_4_ + fVar236 * auVar21._8_4_ + auVar22._8_4_ * fVar231;
  auVar166._12_4_ = fVar214 * auVar20._12_4_ + fVar216 * auVar21._12_4_ + auVar22._12_4_ * fVar212;
  auVar166._16_4_ = fVar232 * auVar20._16_4_ + fVar234 * auVar21._16_4_ + auVar22._16_4_ * fVar217;
  auVar166._20_4_ = fVar213 * auVar20._20_4_ + fVar215 * auVar21._20_4_ + auVar22._20_4_ * fVar211;
  auVar166._24_4_ = fVar233 * auVar20._24_4_ + fVar236 * auVar21._24_4_ + auVar22._24_4_ * fVar231;
  auVar166._28_4_ = fVar192 + auVar18._28_4_ + fVar212;
  auVar17 = vrcpps_avx(auVar15);
  fVar192 = auVar17._0_4_;
  fVar211 = auVar17._4_4_;
  auVar18._4_4_ = auVar15._4_4_ * fVar211;
  auVar18._0_4_ = auVar15._0_4_ * fVar192;
  fVar212 = auVar17._8_4_;
  auVar18._8_4_ = auVar15._8_4_ * fVar212;
  fVar213 = auVar17._12_4_;
  auVar18._12_4_ = auVar15._12_4_ * fVar213;
  fVar214 = auVar17._16_4_;
  auVar18._16_4_ = auVar15._16_4_ * fVar214;
  fVar215 = auVar17._20_4_;
  auVar18._20_4_ = auVar15._20_4_ * fVar215;
  fVar216 = auVar17._24_4_;
  auVar18._24_4_ = auVar15._24_4_ * fVar216;
  auVar18._28_4_ = auVar207._28_4_;
  auVar247._8_4_ = 0x3f800000;
  auVar247._0_8_ = 0x3f8000003f800000;
  auVar247._12_4_ = 0x3f800000;
  auVar247._16_4_ = 0x3f800000;
  auVar247._20_4_ = 0x3f800000;
  auVar247._24_4_ = 0x3f800000;
  auVar247._28_4_ = 0x3f800000;
  auVar18 = vsubps_avx(auVar247,auVar18);
  auVar15 = vrcpps_avx(auVar16);
  fVar192 = fVar192 + fVar192 * auVar18._0_4_;
  fVar211 = fVar211 + fVar211 * auVar18._4_4_;
  fVar212 = fVar212 + fVar212 * auVar18._8_4_;
  fVar213 = fVar213 + fVar213 * auVar18._12_4_;
  fVar214 = fVar214 + fVar214 * auVar18._16_4_;
  fVar215 = fVar215 + fVar215 * auVar18._20_4_;
  fVar216 = fVar216 + fVar216 * auVar18._24_4_;
  fVar217 = auVar15._0_4_;
  fVar231 = auVar15._4_4_;
  auVar19._4_4_ = auVar16._4_4_ * fVar231;
  auVar19._0_4_ = auVar16._0_4_ * fVar217;
  fVar232 = auVar15._8_4_;
  auVar19._8_4_ = auVar16._8_4_ * fVar232;
  fVar233 = auVar15._12_4_;
  auVar19._12_4_ = auVar16._12_4_ * fVar233;
  fVar234 = auVar15._16_4_;
  auVar19._16_4_ = auVar16._16_4_ * fVar234;
  fVar236 = auVar15._20_4_;
  auVar19._20_4_ = auVar16._20_4_ * fVar236;
  fVar237 = auVar15._24_4_;
  auVar19._24_4_ = auVar16._24_4_ * fVar237;
  auVar19._28_4_ = auVar17._28_4_;
  auVar15 = vsubps_avx(auVar247,auVar19);
  fVar217 = fVar217 + fVar217 * auVar15._0_4_;
  fVar231 = fVar231 + fVar231 * auVar15._4_4_;
  fVar232 = fVar232 + fVar232 * auVar15._8_4_;
  fVar233 = fVar233 + fVar233 * auVar15._12_4_;
  fVar234 = fVar234 + fVar234 * auVar15._16_4_;
  fVar236 = fVar236 + fVar236 * auVar15._20_4_;
  fVar237 = fVar237 + fVar237 * auVar15._24_4_;
  auVar15 = vrcpps_avx(auVar90);
  fVar168 = auVar15._0_4_;
  fVar186 = auVar15._4_4_;
  auVar16._4_4_ = fVar186 * auVar90._4_4_;
  auVar16._0_4_ = fVar168 * auVar90._0_4_;
  fVar187 = auVar15._8_4_;
  auVar16._8_4_ = fVar187 * auVar90._8_4_;
  fVar188 = auVar15._12_4_;
  auVar16._12_4_ = fVar188 * auVar90._12_4_;
  fVar189 = auVar15._16_4_;
  auVar16._16_4_ = fVar189 * auVar90._16_4_;
  fVar190 = auVar15._20_4_;
  auVar16._20_4_ = fVar190 * auVar90._20_4_;
  fVar191 = auVar15._24_4_;
  auVar16._24_4_ = fVar191 * auVar90._24_4_;
  auVar16._28_4_ = auVar90._28_4_;
  auVar90 = vsubps_avx(auVar247,auVar16);
  fVar168 = fVar168 + fVar168 * auVar90._0_4_;
  fVar186 = fVar186 + fVar186 * auVar90._4_4_;
  fVar187 = fVar187 + fVar187 * auVar90._8_4_;
  fVar188 = fVar188 + fVar188 * auVar90._12_4_;
  fVar189 = fVar189 + fVar189 * auVar90._16_4_;
  fVar190 = fVar190 + fVar190 * auVar90._20_4_;
  fVar191 = fVar191 + fVar191 * auVar90._24_4_;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar66 * 7 + 6);
  auVar79 = vpmovsxwd_avx(auVar79);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar66 * 7 + 0xe);
  auVar23 = vpmovsxwd_avx(auVar23);
  auVar91._16_16_ = auVar23;
  auVar91._0_16_ = auVar79;
  auVar90 = vcvtdq2ps_avx(auVar91);
  auVar90 = vsubps_avx(auVar90,auVar124);
  auVar74._0_4_ = fVar192 * auVar90._0_4_;
  auVar74._4_4_ = fVar211 * auVar90._4_4_;
  auVar74._8_4_ = fVar212 * auVar90._8_4_;
  auVar74._12_4_ = fVar213 * auVar90._12_4_;
  auVar17._16_4_ = fVar214 * auVar90._16_4_;
  auVar17._0_16_ = auVar74;
  auVar17._20_4_ = fVar215 * auVar90._20_4_;
  auVar17._24_4_ = fVar216 * auVar90._24_4_;
  auVar17._28_4_ = auVar90._28_4_;
  auVar150._8_8_ = 0;
  auVar150._0_8_ = *(ulong *)(prim + lVar1 + 6);
  auVar79 = vpmovsxwd_avx(auVar150);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + lVar1 + 0xe);
  auVar23 = vpmovsxwd_avx(auVar6);
  auVar248._16_16_ = auVar23;
  auVar248._0_16_ = auVar79;
  auVar90 = vcvtdq2ps_avx(auVar248);
  auVar90 = vsubps_avx(auVar90,auVar124);
  auVar101._0_4_ = fVar192 * auVar90._0_4_;
  auVar101._4_4_ = fVar211 * auVar90._4_4_;
  auVar101._8_4_ = fVar212 * auVar90._8_4_;
  auVar101._12_4_ = fVar213 * auVar90._12_4_;
  auVar20._16_4_ = fVar214 * auVar90._16_4_;
  auVar20._0_16_ = auVar101;
  auVar20._20_4_ = fVar215 * auVar90._20_4_;
  auVar20._24_4_ = fVar216 * auVar90._24_4_;
  auVar20._28_4_ = auVar90._28_4_;
  lVar71 = (ulong)(byte)PVar10 * 0x10;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + lVar71 + 6);
  auVar79 = vpmovsxwd_avx(auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + lVar71 + 0xe);
  auVar23 = vpmovsxwd_avx(auVar8);
  lVar71 = lVar71 + uVar66 * -2;
  auVar118._8_8_ = 0;
  auVar118._0_8_ = *(ulong *)(prim + lVar71 + 6);
  auVar150 = vpmovsxwd_avx(auVar118);
  auVar107._8_8_ = 0;
  auVar107._0_8_ = *(ulong *)(prim + lVar71 + 0xe);
  auVar6 = vpmovsxwd_avx(auVar107);
  auVar208._16_16_ = auVar6;
  auVar208._0_16_ = auVar150;
  auVar90 = vcvtdq2ps_avx(auVar208);
  auVar90 = vsubps_avx(auVar90,auVar154);
  auVar194._0_4_ = fVar217 * auVar90._0_4_;
  auVar194._4_4_ = fVar231 * auVar90._4_4_;
  auVar194._8_4_ = fVar232 * auVar90._8_4_;
  auVar194._12_4_ = fVar233 * auVar90._12_4_;
  auVar21._16_4_ = fVar234 * auVar90._16_4_;
  auVar21._0_16_ = auVar194;
  auVar21._20_4_ = fVar236 * auVar90._20_4_;
  auVar21._24_4_ = fVar237 * auVar90._24_4_;
  auVar21._28_4_ = auVar90._28_4_;
  auVar249._16_16_ = auVar23;
  auVar249._0_16_ = auVar79;
  auVar90 = vcvtdq2ps_avx(auVar249);
  auVar90 = vsubps_avx(auVar90,auVar154);
  auVar132._0_4_ = fVar217 * auVar90._0_4_;
  auVar132._4_4_ = fVar231 * auVar90._4_4_;
  auVar132._8_4_ = fVar232 * auVar90._8_4_;
  auVar132._12_4_ = fVar233 * auVar90._12_4_;
  auVar22._16_4_ = fVar234 * auVar90._16_4_;
  auVar22._0_16_ = auVar132;
  auVar22._20_4_ = fVar236 * auVar90._20_4_;
  auVar22._24_4_ = fVar237 * auVar90._24_4_;
  auVar22._28_4_ = auVar90._28_4_;
  auVar140._8_8_ = 0;
  auVar140._0_8_ = *(ulong *)(prim + uVar68 + uVar66 + 6);
  auVar79 = vpmovsxwd_avx(auVar140);
  auVar108._8_8_ = 0;
  auVar108._0_8_ = *(ulong *)(prim + uVar68 + uVar66 + 0xe);
  auVar23 = vpmovsxwd_avx(auVar108);
  auVar229._16_16_ = auVar23;
  auVar229._0_16_ = auVar79;
  auVar90 = vcvtdq2ps_avx(auVar229);
  auVar90 = vsubps_avx(auVar90,auVar166);
  auVar218._0_4_ = fVar168 * auVar90._0_4_;
  auVar218._4_4_ = fVar186 * auVar90._4_4_;
  auVar218._8_4_ = fVar187 * auVar90._8_4_;
  auVar218._12_4_ = fVar188 * auVar90._12_4_;
  auVar24._16_4_ = fVar189 * auVar90._16_4_;
  auVar24._0_16_ = auVar218;
  auVar24._20_4_ = fVar190 * auVar90._20_4_;
  auVar24._24_4_ = fVar191 * auVar90._24_4_;
  auVar24._28_4_ = auVar90._28_4_;
  auVar235._8_8_ = 0;
  auVar235._0_8_ = *(ulong *)(prim + uVar66 * 0x17 + 6);
  auVar79 = vpmovsxwd_avx(auVar235);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar66 * 0x17 + 0xe);
  auVar23 = vpmovsxwd_avx(auVar9);
  auVar250._16_16_ = auVar23;
  auVar250._0_16_ = auVar79;
  auVar90 = vcvtdq2ps_avx(auVar250);
  auVar90 = vsubps_avx(auVar90,auVar166);
  auVar158._0_4_ = fVar168 * auVar90._0_4_;
  auVar158._4_4_ = fVar186 * auVar90._4_4_;
  auVar158._8_4_ = fVar187 * auVar90._8_4_;
  auVar158._12_4_ = fVar188 * auVar90._12_4_;
  auVar25._16_4_ = fVar189 * auVar90._16_4_;
  auVar25._0_16_ = auVar158;
  auVar25._20_4_ = fVar190 * auVar90._20_4_;
  auVar25._24_4_ = fVar191 * auVar90._24_4_;
  auVar25._28_4_ = auVar90._28_4_;
  auVar79 = vpminsd_avx(auVar17._16_16_,auVar20._16_16_);
  auVar23 = vpminsd_avx(auVar74,auVar101);
  auVar283._16_16_ = auVar79;
  auVar283._0_16_ = auVar23;
  auVar79 = vpminsd_avx(auVar21._16_16_,auVar22._16_16_);
  auVar23 = vpminsd_avx(auVar194,auVar132);
  auVar296._16_16_ = auVar79;
  auVar296._0_16_ = auVar23;
  auVar90 = vmaxps_avx(auVar283,auVar296);
  auVar79 = vpminsd_avx(auVar24._16_16_,auVar25._16_16_);
  auVar23 = vpminsd_avx(auVar218,auVar158);
  auVar317._16_16_ = auVar79;
  auVar317._0_16_ = auVar23;
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar327._4_4_ = uVar4;
  auVar327._0_4_ = uVar4;
  auVar327._8_4_ = uVar4;
  auVar327._12_4_ = uVar4;
  auVar327._16_4_ = uVar4;
  auVar327._20_4_ = uVar4;
  auVar327._24_4_ = uVar4;
  auVar327._28_4_ = uVar4;
  auVar15 = vmaxps_avx(auVar317,auVar327);
  auVar90 = vmaxps_avx(auVar90,auVar15);
  local_198._4_4_ = auVar90._4_4_ * 0.99999964;
  local_198._0_4_ = auVar90._0_4_ * 0.99999964;
  local_198._8_4_ = auVar90._8_4_ * 0.99999964;
  local_198._12_4_ = auVar90._12_4_ * 0.99999964;
  local_198._16_4_ = auVar90._16_4_ * 0.99999964;
  local_198._20_4_ = auVar90._20_4_ * 0.99999964;
  local_198._24_4_ = auVar90._24_4_ * 0.99999964;
  local_198._28_4_ = auVar90._28_4_;
  auVar79 = vpmaxsd_avx(auVar17._16_16_,auVar20._16_16_);
  auVar23 = vpmaxsd_avx(auVar74,auVar101);
  auVar92._16_16_ = auVar79;
  auVar92._0_16_ = auVar23;
  auVar79 = vpmaxsd_avx(auVar21._16_16_,auVar22._16_16_);
  auVar23 = vpmaxsd_avx(auVar194,auVar132);
  auVar125._16_16_ = auVar79;
  auVar125._0_16_ = auVar23;
  auVar90 = vminps_avx(auVar92,auVar125);
  auVar79 = vpmaxsd_avx(auVar24._16_16_,auVar25._16_16_);
  auVar23 = vpmaxsd_avx(auVar218,auVar158);
  auVar126._16_16_ = auVar79;
  auVar126._0_16_ = auVar23;
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar155._4_4_ = uVar4;
  auVar155._0_4_ = uVar4;
  auVar155._8_4_ = uVar4;
  auVar155._12_4_ = uVar4;
  auVar155._16_4_ = uVar4;
  auVar155._20_4_ = uVar4;
  auVar155._24_4_ = uVar4;
  auVar155._28_4_ = uVar4;
  auVar15 = vminps_avx(auVar126,auVar155);
  auVar90 = vminps_avx(auVar90,auVar15);
  auVar15._4_4_ = auVar90._4_4_ * 1.0000004;
  auVar15._0_4_ = auVar90._0_4_ * 1.0000004;
  auVar15._8_4_ = auVar90._8_4_ * 1.0000004;
  auVar15._12_4_ = auVar90._12_4_ * 1.0000004;
  auVar15._16_4_ = auVar90._16_4_ * 1.0000004;
  auVar15._20_4_ = auVar90._20_4_ * 1.0000004;
  auVar15._24_4_ = auVar90._24_4_ * 1.0000004;
  auVar15._28_4_ = auVar90._28_4_;
  auVar90 = vcmpps_avx(local_198,auVar15,2);
  auVar79 = vpshufd_avx(ZEXT116((byte)PVar10),0);
  auVar127._16_16_ = auVar79;
  auVar127._0_16_ = auVar79;
  auVar15 = vcvtdq2ps_avx(auVar127);
  auVar15 = vcmpps_avx(_DAT_01faff40,auVar15,1);
  auVar90 = vandps_avx(auVar90,auVar15);
  uVar65 = vmovmskps_avx(auVar90);
  if (uVar65 == 0) {
    return false;
  }
  uVar65 = uVar65 & 0xff;
  pLVar72 = pre->ray_space + k;
  auVar93._16_16_ = mm_lookupmask_ps._240_16_;
  auVar93._0_16_ = mm_lookupmask_ps._240_16_;
  local_178 = vblendps_avx(auVar93,ZEXT832(0) << 0x20,0x80);
  local_498 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_490 = pLVar72;
LAB_01066902:
  lVar71 = 0;
  if (uVar65 != 0) {
    for (; (uVar65 >> lVar71 & 1) == 0; lVar71 = lVar71 + 1) {
    }
  }
  uVar67 = *(uint *)(prim + 2);
  pGVar11 = (context->scene->geometries).items[uVar67].ptr;
  lVar12 = *(long *)&pGVar11[1].time_range.upper;
  uVar66 = (ulong)*(uint *)(*(long *)&pGVar11->field_0x58 +
                           (ulong)*(uint *)(prim + lVar71 * 4 + 6) *
                           pGVar11[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  pfVar2 = (float *)(lVar12 + (long)pGVar11[1].intersectionFilterN * uVar66);
  fVar214 = *pfVar2;
  fVar234 = pfVar2[1];
  fVar215 = pfVar2[2];
  fVar236 = pfVar2[3];
  lVar1 = uVar66 + 1;
  auVar79 = *(undefined1 (*) [16])(lVar12 + (long)pGVar11[1].intersectionFilterN * lVar1);
  _Var13 = pGVar11[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar2 = (float *)(_Var13 + (long)pGVar11[2].userPtr * uVar66);
  fVar216 = *pfVar2;
  fVar237 = pfVar2[1];
  fVar168 = pfVar2[2];
  fVar186 = pfVar2[3];
  auVar23 = *(undefined1 (*) [16])(_Var13 + (long)pGVar11[2].userPtr * lVar1);
  pfVar2 = (float *)(pGVar11[2].intersectionFilterN + (long)pGVar11[2].pointQueryFunc * uVar66);
  pfVar3 = (float *)(pGVar11[2].intersectionFilterN + (long)pGVar11[2].pointQueryFunc * lVar1);
  auVar133._0_4_ = *pfVar3 * 0.33333334;
  auVar133._4_4_ = pfVar3[1] * 0.33333334;
  auVar133._8_4_ = pfVar3[2] * 0.33333334;
  auVar133._12_4_ = pfVar3[3] * 0.33333334;
  pfVar3 = (float *)((long)pGVar11[3].userPtr + uVar66 * *(long *)&pGVar11[3].fnumTimeSegments);
  auVar150 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar6 = vinsertps_avx(auVar150,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar187 = fVar214 + *pfVar2 * 0.33333334;
  fVar188 = fVar234 + pfVar2[1] * 0.33333334;
  fVar189 = fVar215 + pfVar2[2] * 0.33333334;
  fVar190 = fVar236 + pfVar2[3] * 0.33333334;
  auVar150 = vsubps_avx(auVar79,auVar133);
  fVar191 = fVar216 + *pfVar3 * 0.33333334;
  fVar286 = fVar237 + pfVar3[1] * 0.33333334;
  fVar287 = fVar168 + pfVar3[2] * 0.33333334;
  fVar288 = fVar186 + pfVar3[3] * 0.33333334;
  pfVar2 = (float *)((long)pGVar11[3].userPtr + *(long *)&pGVar11[3].fnumTimeSegments * lVar1);
  auVar102._0_4_ = *pfVar2 * 0.33333334;
  auVar102._4_4_ = pfVar2[1] * 0.33333334;
  auVar102._8_4_ = pfVar2[2] * 0.33333334;
  auVar102._12_4_ = pfVar2[3] * 0.33333334;
  auVar7 = vsubps_avx(auVar23,auVar102);
  fVar192 = auVar79._0_4_;
  fVar211 = auVar79._4_4_;
  fVar212 = auVar79._8_4_;
  fVar213 = auVar79._12_4_;
  fVar289 = auVar150._0_4_ * 0.0;
  fVar298 = auVar150._4_4_ * 0.0;
  fVar299 = auVar150._8_4_ * 0.0;
  fVar300 = auVar150._12_4_ * 0.0;
  fVar217 = fVar289 + fVar192 * 0.0;
  fVar231 = fVar298 + fVar211 * 0.0;
  fVar232 = fVar299 + fVar212 * 0.0;
  fVar233 = fVar300 + fVar213 * 0.0;
  fVar301 = fVar187 * 0.0;
  fVar305 = fVar188 * 0.0;
  fVar306 = fVar189 * 0.0;
  fVar307 = fVar190 * 0.0;
  local_5a8._0_4_ = fVar214 + fVar301 + fVar217;
  local_5a8._4_4_ = fVar234 + fVar305 + fVar231;
  fStack_5a0 = fVar215 + fVar306 + fVar232;
  fStack_59c = fVar236 + fVar307 + fVar233;
  auVar134._0_4_ = fVar187 * 3.0 + fVar217;
  auVar134._4_4_ = fVar188 * 3.0 + fVar231;
  auVar134._8_4_ = fVar189 * 3.0 + fVar232;
  auVar134._12_4_ = fVar190 * 3.0 + fVar233;
  auVar252._0_4_ = fVar214 * 3.0;
  auVar252._4_4_ = fVar234 * 3.0;
  auVar252._8_4_ = fVar215 * 3.0;
  auVar252._12_4_ = fVar236 * 3.0;
  auVar235 = vsubps_avx(auVar134,auVar252);
  fVar217 = auVar23._0_4_;
  fVar231 = auVar23._4_4_;
  fVar232 = auVar23._8_4_;
  fVar233 = auVar23._12_4_;
  fVar312 = auVar7._0_4_ * 0.0;
  fVar318 = auVar7._4_4_ * 0.0;
  fVar319 = auVar7._8_4_ * 0.0;
  fVar320 = auVar7._12_4_ * 0.0;
  fVar187 = fVar217 * 0.0 + fVar312;
  fVar188 = fVar231 * 0.0 + fVar318;
  fVar189 = fVar232 * 0.0 + fVar319;
  fVar190 = fVar233 * 0.0 + fVar320;
  fVar322 = fVar191 * 0.0;
  fVar329 = fVar286 * 0.0;
  fVar330 = fVar287 * 0.0;
  fVar331 = fVar288 * 0.0;
  auVar332._0_4_ = fVar322 + fVar187 + fVar216;
  auVar332._4_4_ = fVar329 + fVar188 + fVar237;
  auVar332._8_4_ = fVar330 + fVar189 + fVar168;
  auVar332._12_4_ = fVar331 + fVar190 + fVar186;
  auVar253._0_4_ = fVar191 * 3.0 + fVar187;
  auVar253._4_4_ = fVar286 * 3.0 + fVar188;
  auVar253._8_4_ = fVar287 * 3.0 + fVar189;
  auVar253._12_4_ = fVar288 * 3.0 + fVar190;
  auVar278._0_4_ = fVar216 * 3.0;
  auVar278._4_4_ = fVar237 * 3.0;
  auVar278._8_4_ = fVar168 * 3.0;
  auVar278._12_4_ = fVar186 * 3.0;
  auVar8 = vsubps_avx(auVar253,auVar278);
  auVar290._0_4_ = fVar214 * 0.0;
  auVar290._4_4_ = fVar234 * 0.0;
  auVar290._8_4_ = fVar215 * 0.0;
  auVar290._12_4_ = fVar236 * 0.0;
  auVar159._0_4_ = auVar290._0_4_ + fVar301 + fVar289 + fVar192;
  auVar159._4_4_ = auVar290._4_4_ + fVar305 + fVar298 + fVar211;
  auVar159._8_4_ = auVar290._8_4_ + fVar306 + fVar299 + fVar212;
  auVar159._12_4_ = auVar290._12_4_ + fVar307 + fVar300 + fVar213;
  auVar169._0_4_ = fVar192 * 3.0;
  auVar169._4_4_ = fVar211 * 3.0;
  auVar169._8_4_ = fVar212 * 3.0;
  auVar169._12_4_ = fVar213 * 3.0;
  auVar254._0_4_ = auVar150._0_4_ * 3.0;
  auVar254._4_4_ = auVar150._4_4_ * 3.0;
  auVar254._8_4_ = auVar150._8_4_ * 3.0;
  auVar254._12_4_ = auVar150._12_4_ * 3.0;
  auVar79 = vsubps_avx(auVar169,auVar254);
  auVar170._0_4_ = fVar301 + auVar79._0_4_;
  auVar170._4_4_ = fVar305 + auVar79._4_4_;
  auVar170._8_4_ = fVar306 + auVar79._8_4_;
  auVar170._12_4_ = fVar307 + auVar79._12_4_;
  auVar9 = vsubps_avx(auVar170,auVar290);
  auVar195._0_4_ = fVar216 * 0.0;
  auVar195._4_4_ = fVar237 * 0.0;
  auVar195._8_4_ = fVar168 * 0.0;
  auVar195._12_4_ = fVar186 * 0.0;
  auVar263._0_4_ = fVar322 + fVar312 + fVar217 + auVar195._0_4_;
  auVar263._4_4_ = fVar329 + fVar318 + fVar231 + auVar195._4_4_;
  auVar263._8_4_ = fVar330 + fVar319 + fVar232 + auVar195._8_4_;
  auVar263._12_4_ = fVar331 + fVar320 + fVar233 + auVar195._12_4_;
  auVar219._0_4_ = fVar217 * 3.0;
  auVar219._4_4_ = fVar231 * 3.0;
  auVar219._8_4_ = fVar232 * 3.0;
  auVar219._12_4_ = fVar233 * 3.0;
  auVar238._0_4_ = auVar7._0_4_ * 3.0;
  auVar238._4_4_ = auVar7._4_4_ * 3.0;
  auVar238._8_4_ = auVar7._8_4_ * 3.0;
  auVar238._12_4_ = auVar7._12_4_ * 3.0;
  auVar79 = vsubps_avx(auVar219,auVar238);
  auVar220._0_4_ = fVar322 + auVar79._0_4_;
  auVar220._4_4_ = fVar329 + auVar79._4_4_;
  auVar220._8_4_ = fVar330 + auVar79._8_4_;
  auVar220._12_4_ = fVar331 + auVar79._12_4_;
  auVar118 = vsubps_avx(auVar220,auVar195);
  auVar79 = vshufps_avx(auVar235,auVar235,0xc9);
  auVar23 = vshufps_avx(auVar332,auVar332,0xc9);
  fVar187 = auVar235._0_4_;
  auVar239._0_4_ = fVar187 * auVar23._0_4_;
  fVar188 = auVar235._4_4_;
  auVar239._4_4_ = fVar188 * auVar23._4_4_;
  fVar189 = auVar235._8_4_;
  auVar239._8_4_ = fVar189 * auVar23._8_4_;
  fVar190 = auVar235._12_4_;
  auVar239._12_4_ = fVar190 * auVar23._12_4_;
  auVar255._0_4_ = auVar332._0_4_ * auVar79._0_4_;
  auVar255._4_4_ = auVar332._4_4_ * auVar79._4_4_;
  auVar255._8_4_ = auVar332._8_4_ * auVar79._8_4_;
  auVar255._12_4_ = auVar332._12_4_ * auVar79._12_4_;
  auVar23 = vsubps_avx(auVar255,auVar239);
  auVar150 = vshufps_avx(auVar23,auVar23,0xc9);
  auVar23 = vshufps_avx(auVar8,auVar8,0xc9);
  auVar240._0_4_ = fVar187 * auVar23._0_4_;
  auVar240._4_4_ = fVar188 * auVar23._4_4_;
  auVar240._8_4_ = fVar189 * auVar23._8_4_;
  auVar240._12_4_ = fVar190 * auVar23._12_4_;
  auVar196._0_4_ = auVar8._0_4_ * auVar79._0_4_;
  auVar196._4_4_ = auVar8._4_4_ * auVar79._4_4_;
  auVar196._8_4_ = auVar8._8_4_ * auVar79._8_4_;
  auVar196._12_4_ = auVar8._12_4_ * auVar79._12_4_;
  auVar79 = vsubps_avx(auVar196,auVar240);
  auVar7 = vshufps_avx(auVar79,auVar79,0xc9);
  auVar79 = vshufps_avx(auVar9,auVar9,0xc9);
  auVar23 = vshufps_avx(auVar263,auVar263,0xc9);
  fVar191 = auVar9._0_4_;
  auVar197._0_4_ = fVar191 * auVar23._0_4_;
  fVar286 = auVar9._4_4_;
  auVar197._4_4_ = fVar286 * auVar23._4_4_;
  fVar287 = auVar9._8_4_;
  auVar197._8_4_ = fVar287 * auVar23._8_4_;
  fVar288 = auVar9._12_4_;
  auVar197._12_4_ = fVar288 * auVar23._12_4_;
  auVar264._0_4_ = auVar263._0_4_ * auVar79._0_4_;
  auVar264._4_4_ = auVar263._4_4_ * auVar79._4_4_;
  auVar264._8_4_ = auVar263._8_4_ * auVar79._8_4_;
  auVar264._12_4_ = auVar263._12_4_ * auVar79._12_4_;
  auVar23 = vsubps_avx(auVar264,auVar197);
  auVar8 = vshufps_avx(auVar23,auVar23,0xc9);
  auVar23 = vshufps_avx(auVar118,auVar118,0xc9);
  auVar265._0_4_ = auVar23._0_4_ * fVar191;
  auVar265._4_4_ = auVar23._4_4_ * fVar286;
  auVar265._8_4_ = auVar23._8_4_ * fVar287;
  auVar265._12_4_ = auVar23._12_4_ * fVar288;
  auVar221._0_4_ = auVar79._0_4_ * auVar118._0_4_;
  auVar221._4_4_ = auVar79._4_4_ * auVar118._4_4_;
  auVar221._8_4_ = auVar79._8_4_ * auVar118._8_4_;
  auVar221._12_4_ = auVar79._12_4_ * auVar118._12_4_;
  auVar79 = vsubps_avx(auVar221,auVar265);
  auVar118 = vshufps_avx(auVar79,auVar79,0xc9);
  auVar79 = vdpps_avx(auVar150,auVar150,0x7f);
  fVar212 = auVar79._0_4_;
  auVar140 = ZEXT416((uint)fVar212);
  auVar23 = vrsqrtss_avx(auVar140,auVar140);
  fVar192 = auVar23._0_4_;
  auVar23 = vdpps_avx(auVar150,auVar7,0x7f);
  auVar107 = ZEXT416((uint)(fVar192 * 1.5 - fVar212 * 0.5 * fVar192 * fVar192 * fVar192));
  auVar107 = vshufps_avx(auVar107,auVar107,0);
  fVar192 = auVar150._0_4_ * auVar107._0_4_;
  fVar217 = auVar150._4_4_ * auVar107._4_4_;
  fVar211 = auVar150._8_4_ * auVar107._8_4_;
  fVar231 = auVar150._12_4_ * auVar107._12_4_;
  auVar79 = vshufps_avx(auVar79,auVar79,0);
  auVar279._0_4_ = auVar79._0_4_ * auVar7._0_4_;
  auVar279._4_4_ = auVar79._4_4_ * auVar7._4_4_;
  auVar279._8_4_ = auVar79._8_4_ * auVar7._8_4_;
  auVar279._12_4_ = auVar79._12_4_ * auVar7._12_4_;
  auVar79 = vshufps_avx(auVar23,auVar23,0);
  auVar256._0_4_ = auVar79._0_4_ * auVar150._0_4_;
  auVar256._4_4_ = auVar79._4_4_ * auVar150._4_4_;
  auVar256._8_4_ = auVar79._8_4_ * auVar150._8_4_;
  auVar256._12_4_ = auVar79._12_4_ * auVar150._12_4_;
  auVar74 = vsubps_avx(auVar279,auVar256);
  auVar79 = vrcpss_avx(auVar140,auVar140);
  auVar79 = ZEXT416((uint)(auVar79._0_4_ * (2.0 - fVar212 * auVar79._0_4_)));
  auVar7 = vshufps_avx(auVar79,auVar79,0);
  auVar23 = vdpps_avx(auVar8,auVar8,0x7f);
  auVar79 = vblendps_avx(auVar23,_DAT_01f7aa10,0xe);
  auVar150 = vrsqrtss_avx(auVar79,auVar79);
  fVar212 = auVar150._0_4_;
  auVar150 = ZEXT416((uint)(fVar212 * 1.5 - auVar23._0_4_ * 0.5 * fVar212 * fVar212 * fVar212));
  auVar140 = vshufps_avx(auVar150,auVar150,0);
  fVar212 = auVar140._0_4_ * auVar8._0_4_;
  fVar232 = auVar140._4_4_ * auVar8._4_4_;
  fVar213 = auVar140._8_4_ * auVar8._8_4_;
  fVar233 = auVar140._12_4_ * auVar8._12_4_;
  auVar150 = vdpps_avx(auVar8,auVar118,0x7f);
  auVar108 = vshufps_avx(auVar23,auVar23,0);
  auVar241._0_4_ = auVar108._0_4_ * auVar118._0_4_;
  auVar241._4_4_ = auVar108._4_4_ * auVar118._4_4_;
  auVar241._8_4_ = auVar108._8_4_ * auVar118._8_4_;
  auVar241._12_4_ = auVar108._12_4_ * auVar118._12_4_;
  auVar150 = vshufps_avx(auVar150,auVar150,0);
  auVar198._0_4_ = auVar150._0_4_ * auVar8._0_4_;
  auVar198._4_4_ = auVar150._4_4_ * auVar8._4_4_;
  auVar198._8_4_ = auVar150._8_4_ * auVar8._8_4_;
  auVar198._12_4_ = auVar150._12_4_ * auVar8._12_4_;
  auVar8 = vsubps_avx(auVar241,auVar198);
  auVar79 = vrcpss_avx(auVar79,auVar79);
  auVar79 = ZEXT416((uint)((2.0 - auVar23._0_4_ * auVar79._0_4_) * auVar79._0_4_));
  auVar79 = vshufps_avx(auVar79,auVar79,0);
  auVar23 = vshufps_avx(_local_5a8,_local_5a8,0xff);
  auVar266._0_4_ = auVar23._0_4_ * fVar192;
  auVar266._4_4_ = auVar23._4_4_ * fVar217;
  auVar266._8_4_ = auVar23._8_4_ * fVar211;
  auVar266._12_4_ = auVar23._12_4_ * fVar231;
  _local_428 = vsubps_avx(_local_5a8,auVar266);
  auVar150 = vshufps_avx(auVar235,auVar235,0xff);
  auVar222._0_4_ =
       auVar150._0_4_ * fVar192 + auVar107._0_4_ * auVar74._0_4_ * auVar7._0_4_ * auVar23._0_4_;
  auVar222._4_4_ =
       auVar150._4_4_ * fVar217 + auVar107._4_4_ * auVar74._4_4_ * auVar7._4_4_ * auVar23._4_4_;
  auVar222._8_4_ =
       auVar150._8_4_ * fVar211 + auVar107._8_4_ * auVar74._8_4_ * auVar7._8_4_ * auVar23._8_4_;
  auVar222._12_4_ =
       auVar150._12_4_ * fVar231 + auVar107._12_4_ * auVar74._12_4_ * auVar7._12_4_ * auVar23._12_4_
  ;
  auVar7 = vsubps_avx(auVar235,auVar222);
  local_438._0_4_ = auVar266._0_4_ + (float)local_5a8._0_4_;
  local_438._4_4_ = auVar266._4_4_ + (float)local_5a8._4_4_;
  fStack_430 = auVar266._8_4_ + fStack_5a0;
  fStack_42c = auVar266._12_4_ + fStack_59c;
  auVar23 = vshufps_avx(auVar159,auVar159,0xff);
  auVar135._0_4_ = fVar212 * auVar23._0_4_;
  auVar135._4_4_ = fVar232 * auVar23._4_4_;
  auVar135._8_4_ = fVar213 * auVar23._8_4_;
  auVar135._12_4_ = fVar233 * auVar23._12_4_;
  _local_448 = vsubps_avx(auVar159,auVar135);
  auVar150 = vshufps_avx(auVar9,auVar9,0xff);
  auVar103._0_4_ =
       fVar212 * auVar150._0_4_ + auVar23._0_4_ * auVar140._0_4_ * auVar8._0_4_ * auVar79._0_4_;
  auVar103._4_4_ =
       fVar232 * auVar150._4_4_ + auVar23._4_4_ * auVar140._4_4_ * auVar8._4_4_ * auVar79._4_4_;
  auVar103._8_4_ =
       fVar213 * auVar150._8_4_ + auVar23._8_4_ * auVar140._8_4_ * auVar8._8_4_ * auVar79._8_4_;
  auVar103._12_4_ =
       fVar233 * auVar150._12_4_ + auVar23._12_4_ * auVar140._12_4_ * auVar8._12_4_ * auVar79._12_4_
  ;
  auVar8 = vsubps_avx(auVar9,auVar103);
  local_458._0_4_ = auVar159._0_4_ + auVar135._0_4_;
  local_458._4_4_ = auVar159._4_4_ + auVar135._4_4_;
  fStack_450 = auVar159._8_4_ + auVar135._8_4_;
  fStack_44c = auVar159._12_4_ + auVar135._12_4_;
  local_468._0_4_ = local_428._0_4_ + auVar7._0_4_ * 0.33333334;
  local_468._4_4_ = local_428._4_4_ + auVar7._4_4_ * 0.33333334;
  fStack_460 = local_428._8_4_ + auVar7._8_4_ * 0.33333334;
  fStack_45c = local_428._12_4_ + auVar7._12_4_ * 0.33333334;
  local_2a8 = vsubps_avx(_local_428,auVar6);
  auVar23 = vmovsldup_avx(local_2a8);
  auVar79 = vmovshdup_avx(local_2a8);
  auVar150 = vshufps_avx(local_2a8,local_2a8,0xaa);
  fVar192 = (pLVar72->vx).field_0.m128[0];
  fVar217 = (pLVar72->vx).field_0.m128[1];
  fVar211 = (pLVar72->vx).field_0.m128[2];
  fVar231 = (pLVar72->vx).field_0.m128[3];
  fVar212 = (pLVar72->vy).field_0.m128[0];
  fVar232 = (pLVar72->vy).field_0.m128[1];
  fVar213 = (pLVar72->vy).field_0.m128[2];
  fVar233 = (pLVar72->vy).field_0.m128[3];
  fVar214 = (pLVar72->vz).field_0.m128[0];
  fVar234 = (pLVar72->vz).field_0.m128[1];
  fVar215 = (pLVar72->vz).field_0.m128[2];
  fVar236 = (pLVar72->vz).field_0.m128[3];
  fVar216 = fVar192 * auVar23._0_4_ + auVar150._0_4_ * fVar214 + fVar212 * auVar79._0_4_;
  fVar168 = fVar217 * auVar23._4_4_ + auVar150._4_4_ * fVar234 + fVar232 * auVar79._4_4_;
  local_5a8._4_4_ = fVar168;
  local_5a8._0_4_ = fVar216;
  fStack_5a0 = fVar211 * auVar23._8_4_ + auVar150._8_4_ * fVar215 + fVar213 * auVar79._8_4_;
  fStack_59c = fVar231 * auVar23._12_4_ + auVar150._12_4_ * fVar236 + fVar233 * auVar79._12_4_;
  local_2b8 = vsubps_avx(_local_468,auVar6);
  auVar150 = vshufps_avx(local_2b8,local_2b8,0xaa);
  auVar79 = vmovshdup_avx(local_2b8);
  auVar23 = vmovsldup_avx(local_2b8);
  fVar237 = auVar23._0_4_ * fVar192 + auVar79._0_4_ * fVar212 + fVar214 * auVar150._0_4_;
  fVar186 = auVar23._4_4_ * fVar217 + auVar79._4_4_ * fVar232 + fVar234 * auVar150._4_4_;
  local_538._4_4_ = fVar186;
  local_538._0_4_ = fVar237;
  fStack_530 = auVar23._8_4_ * fVar211 + auVar79._8_4_ * fVar213 + fVar215 * auVar150._8_4_;
  fStack_52c = auVar23._12_4_ * fVar231 + auVar79._12_4_ * fVar233 + fVar236 * auVar150._12_4_;
  auVar199._0_4_ = auVar8._0_4_ * 0.33333334;
  auVar199._4_4_ = auVar8._4_4_ * 0.33333334;
  auVar199._8_4_ = auVar8._8_4_ * 0.33333334;
  auVar199._12_4_ = auVar8._12_4_ * 0.33333334;
  _local_478 = vsubps_avx(_local_448,auVar199);
  local_2c8 = vsubps_avx(_local_478,auVar6);
  auVar150 = vshufps_avx(local_2c8,local_2c8,0xaa);
  auVar79 = vmovshdup_avx(local_2c8);
  auVar23 = vmovsldup_avx(local_2c8);
  auVar302._0_4_ = auVar23._0_4_ * fVar192 + auVar79._0_4_ * fVar212 + fVar214 * auVar150._0_4_;
  auVar302._4_4_ = auVar23._4_4_ * fVar217 + auVar79._4_4_ * fVar232 + fVar234 * auVar150._4_4_;
  auVar302._8_4_ = auVar23._8_4_ * fVar211 + auVar79._8_4_ * fVar213 + fVar215 * auVar150._8_4_;
  auVar302._12_4_ = auVar23._12_4_ * fVar231 + auVar79._12_4_ * fVar233 + fVar236 * auVar150._12_4_;
  local_2d8 = vsubps_avx(_local_448,auVar6);
  auVar150 = vshufps_avx(local_2d8,local_2d8,0xaa);
  auVar79 = vmovshdup_avx(local_2d8);
  auVar23 = vmovsldup_avx(local_2d8);
  auVar313._0_4_ = auVar23._0_4_ * fVar192 + auVar79._0_4_ * fVar212 + auVar150._0_4_ * fVar214;
  auVar313._4_4_ = auVar23._4_4_ * fVar217 + auVar79._4_4_ * fVar232 + auVar150._4_4_ * fVar234;
  auVar313._8_4_ = auVar23._8_4_ * fVar211 + auVar79._8_4_ * fVar213 + auVar150._8_4_ * fVar215;
  auVar313._12_4_ = auVar23._12_4_ * fVar231 + auVar79._12_4_ * fVar233 + auVar150._12_4_ * fVar236;
  local_2e8 = vsubps_avx(_local_438,auVar6);
  auVar150 = vshufps_avx(local_2e8,local_2e8,0xaa);
  auVar79 = vmovshdup_avx(local_2e8);
  auVar23 = vmovsldup_avx(local_2e8);
  auVar323._0_4_ = auVar23._0_4_ * fVar192 + auVar79._0_4_ * fVar212 + auVar150._0_4_ * fVar214;
  auVar323._4_4_ = auVar23._4_4_ * fVar217 + auVar79._4_4_ * fVar232 + auVar150._4_4_ * fVar234;
  auVar323._8_4_ = auVar23._8_4_ * fVar211 + auVar79._8_4_ * fVar213 + auVar150._8_4_ * fVar215;
  auVar323._12_4_ = auVar23._12_4_ * fVar231 + auVar79._12_4_ * fVar233 + auVar150._12_4_ * fVar236;
  local_488._0_4_ = (fVar187 + auVar222._0_4_) * 0.33333334 + (float)local_438._0_4_;
  local_488._4_4_ = (fVar188 + auVar222._4_4_) * 0.33333334 + (float)local_438._4_4_;
  fStack_480 = (fVar189 + auVar222._8_4_) * 0.33333334 + fStack_430;
  fStack_47c = (fVar190 + auVar222._12_4_) * 0.33333334 + fStack_42c;
  local_2f8 = vsubps_avx(_local_488,auVar6);
  auVar150 = vshufps_avx(local_2f8,local_2f8,0xaa);
  auVar79 = vmovshdup_avx(local_2f8);
  auVar23 = vmovsldup_avx(local_2f8);
  auVar257._0_4_ = auVar23._0_4_ * fVar192 + auVar79._0_4_ * fVar212 + auVar150._0_4_ * fVar214;
  auVar257._4_4_ = auVar23._4_4_ * fVar217 + auVar79._4_4_ * fVar232 + auVar150._4_4_ * fVar234;
  auVar257._8_4_ = auVar23._8_4_ * fVar211 + auVar79._8_4_ * fVar213 + auVar150._8_4_ * fVar215;
  auVar257._12_4_ = auVar23._12_4_ * fVar231 + auVar79._12_4_ * fVar233 + auVar150._12_4_ * fVar236;
  auVar242._0_4_ = (fVar191 + auVar103._0_4_) * 0.33333334;
  auVar242._4_4_ = (fVar286 + auVar103._4_4_) * 0.33333334;
  auVar242._8_4_ = (fVar287 + auVar103._8_4_) * 0.33333334;
  auVar242._12_4_ = (fVar288 + auVar103._12_4_) * 0.33333334;
  _local_338 = vsubps_avx(_local_458,auVar242);
  local_308 = vsubps_avx(_local_338,auVar6);
  auVar150 = vshufps_avx(local_308,local_308,0xaa);
  auVar79 = vmovshdup_avx(local_308);
  auVar23 = vmovsldup_avx(local_308);
  auVar267._0_4_ = auVar23._0_4_ * fVar192 + auVar79._0_4_ * fVar212 + fVar214 * auVar150._0_4_;
  auVar267._4_4_ = auVar23._4_4_ * fVar217 + auVar79._4_4_ * fVar232 + fVar234 * auVar150._4_4_;
  auVar267._8_4_ = auVar23._8_4_ * fVar211 + auVar79._8_4_ * fVar213 + fVar215 * auVar150._8_4_;
  auVar267._12_4_ = auVar23._12_4_ * fVar231 + auVar79._12_4_ * fVar233 + fVar236 * auVar150._12_4_;
  local_318 = vsubps_avx(_local_458,auVar6);
  auVar150 = vshufps_avx(local_318,local_318,0xaa);
  auVar79 = vmovshdup_avx(local_318);
  auVar23 = vmovsldup_avx(local_318);
  auVar104._0_4_ = fVar192 * auVar23._0_4_ + fVar212 * auVar79._0_4_ + fVar214 * auVar150._0_4_;
  auVar104._4_4_ = fVar217 * auVar23._4_4_ + fVar232 * auVar79._4_4_ + fVar234 * auVar150._4_4_;
  auVar104._8_4_ = fVar211 * auVar23._8_4_ + fVar213 * auVar79._8_4_ + fVar215 * auVar150._8_4_;
  auVar104._12_4_ = fVar231 * auVar23._12_4_ + fVar233 * auVar79._12_4_ + fVar236 * auVar150._12_4_;
  auVar6 = vmovlhps_avx(_local_5a8,auVar323);
  auVar7 = vmovlhps_avx(_local_538,auVar257);
  auVar8 = vmovlhps_avx(auVar302,auVar267);
  _local_408 = vmovlhps_avx(auVar313,auVar104);
  auVar79 = vminps_avx(auVar6,auVar7);
  auVar23 = vminps_avx(auVar8,_local_408);
  auVar150 = vminps_avx(auVar79,auVar23);
  auVar79 = vmaxps_avx(auVar6,auVar7);
  auVar23 = vmaxps_avx(auVar8,_local_408);
  auVar79 = vmaxps_avx(auVar79,auVar23);
  auVar23 = vshufpd_avx(auVar150,auVar150,3);
  auVar150 = vminps_avx(auVar150,auVar23);
  auVar23 = vshufpd_avx(auVar79,auVar79,3);
  auVar23 = vmaxps_avx(auVar79,auVar23);
  auVar223._8_4_ = 0x7fffffff;
  auVar223._0_8_ = 0x7fffffff7fffffff;
  auVar223._12_4_ = 0x7fffffff;
  auVar79 = vandps_avx(auVar150,auVar223);
  auVar23 = vandps_avx(auVar23,auVar223);
  auVar79 = vmaxps_avx(auVar79,auVar23);
  auVar23 = vmovshdup_avx(auVar79);
  auVar79 = vmaxss_avx(auVar23,auVar79);
  fVar192 = auVar79._0_4_ * 9.536743e-07;
  local_418 = ZEXT416((uint)fVar192);
  auVar79 = vshufps_avx(local_418,ZEXT416((uint)fVar192),0);
  local_78._16_16_ = auVar79;
  local_78._0_16_ = auVar79;
  auVar75._0_8_ = auVar79._0_8_ ^ 0x8000000080000000;
  auVar75._8_4_ = auVar79._8_4_ ^ 0x80000000;
  auVar75._12_4_ = auVar79._12_4_ ^ 0x80000000;
  local_268._16_16_ = auVar75;
  local_268._0_16_ = auVar75;
  local_348 = vpshufd_avx(ZEXT416(uVar67),0);
  local_358 = vpshufd_avx(ZEXT416(*(uint *)(prim + lVar71 * 4 + 6)),0);
  bVar64 = false;
  uVar69 = 0;
  fVar192 = *(float *)(ray + k * 4 + 0x30);
  _local_278 = vsubps_avx(auVar7,auVar6);
  _local_288 = vsubps_avx(auVar8,auVar7);
  _local_298 = vsubps_avx(_local_408,auVar8);
  _local_368 = vsubps_avx(_local_438,_local_428);
  _local_378 = vsubps_avx(_local_488,_local_468);
  _local_388 = vsubps_avx(_local_338,_local_478);
  _local_398 = vsubps_avx(_local_458,_local_448);
  auVar277 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar285 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_010670c2:
  do {
    local_328 = auVar285._0_16_;
    auVar100 = auVar277._0_16_;
    auVar79 = vshufps_avx(auVar100,auVar100,0x50);
    auVar324._8_4_ = 0x3f800000;
    auVar324._0_8_ = 0x3f8000003f800000;
    auVar324._12_4_ = 0x3f800000;
    auVar328._16_4_ = 0x3f800000;
    auVar328._0_16_ = auVar324;
    auVar328._20_4_ = 0x3f800000;
    auVar328._24_4_ = 0x3f800000;
    auVar328._28_4_ = 0x3f800000;
    auVar23 = vsubps_avx(auVar324,auVar79);
    fVar217 = auVar79._0_4_;
    fVar211 = auVar79._4_4_;
    fVar231 = auVar79._8_4_;
    fVar212 = auVar79._12_4_;
    fVar232 = auVar23._0_4_;
    fVar213 = auVar23._4_4_;
    fVar233 = auVar23._8_4_;
    fVar214 = auVar23._12_4_;
    auVar160._0_4_ = auVar323._0_4_ * fVar217 + fVar232 * fVar216;
    auVar160._4_4_ = auVar323._4_4_ * fVar211 + fVar213 * fVar168;
    auVar160._8_4_ = auVar323._0_4_ * fVar231 + fVar233 * fVar216;
    auVar160._12_4_ = auVar323._4_4_ * fVar212 + fVar214 * fVar168;
    auVar136._0_4_ = auVar257._0_4_ * fVar217 + fVar237 * fVar232;
    auVar136._4_4_ = auVar257._4_4_ * fVar211 + fVar186 * fVar213;
    auVar136._8_4_ = auVar257._0_4_ * fVar231 + fVar237 * fVar233;
    auVar136._12_4_ = auVar257._4_4_ * fVar212 + fVar186 * fVar214;
    auVar243._0_4_ = auVar267._0_4_ * fVar217 + auVar302._0_4_ * fVar232;
    auVar243._4_4_ = auVar267._4_4_ * fVar211 + auVar302._4_4_ * fVar213;
    auVar243._8_4_ = auVar267._0_4_ * fVar231 + auVar302._0_4_ * fVar233;
    auVar243._12_4_ = auVar267._4_4_ * fVar212 + auVar302._4_4_ * fVar214;
    auVar171._0_4_ = auVar104._0_4_ * fVar217 + auVar313._0_4_ * fVar232;
    auVar171._4_4_ = auVar104._4_4_ * fVar211 + auVar313._4_4_ * fVar213;
    auVar171._8_4_ = auVar104._0_4_ * fVar231 + auVar313._0_4_ * fVar233;
    auVar171._12_4_ = auVar104._4_4_ * fVar212 + auVar313._4_4_ * fVar214;
    auVar79 = vmovshdup_avx(local_328);
    auVar23 = vshufps_avx(local_328,local_328,0);
    auVar275._16_16_ = auVar23;
    auVar275._0_16_ = auVar23;
    auVar150 = vshufps_avx(local_328,local_328,0x55);
    auVar94._16_16_ = auVar150;
    auVar94._0_16_ = auVar150;
    auVar90 = vsubps_avx(auVar94,auVar275);
    auVar150 = vshufps_avx(auVar160,auVar160,0);
    auVar118 = vshufps_avx(auVar160,auVar160,0x55);
    auVar107 = vshufps_avx(auVar136,auVar136,0);
    auVar140 = vshufps_avx(auVar136,auVar136,0x55);
    auVar108 = vshufps_avx(auVar243,auVar243,0);
    auVar235 = vshufps_avx(auVar243,auVar243,0x55);
    auVar9 = vshufps_avx(auVar171,auVar171,0);
    auVar74 = vshufps_avx(auVar171,auVar171,0x55);
    auVar79 = ZEXT416((uint)((auVar79._0_4_ - auVar285._0_4_) * 0.04761905));
    auVar79 = vshufps_avx(auVar79,auVar79,0);
    auVar284._0_4_ = auVar23._0_4_ + auVar90._0_4_ * 0.0;
    auVar284._4_4_ = auVar23._4_4_ + auVar90._4_4_ * 0.14285715;
    auVar284._8_4_ = auVar23._8_4_ + auVar90._8_4_ * 0.2857143;
    auVar284._12_4_ = auVar23._12_4_ + auVar90._12_4_ * 0.42857146;
    auVar284._16_4_ = auVar23._0_4_ + auVar90._16_4_ * 0.5714286;
    auVar284._20_4_ = auVar23._4_4_ + auVar90._20_4_ * 0.71428573;
    auVar284._24_4_ = auVar23._8_4_ + auVar90._24_4_ * 0.8571429;
    auVar284._28_4_ = auVar23._12_4_ + auVar90._28_4_;
    auVar17 = vsubps_avx(auVar328,auVar284);
    fVar217 = auVar107._0_4_;
    fVar231 = auVar107._4_4_;
    fVar232 = auVar107._8_4_;
    fVar233 = auVar107._12_4_;
    fVar318 = auVar17._0_4_;
    fVar319 = auVar17._4_4_;
    fVar320 = auVar17._8_4_;
    fVar322 = auVar17._12_4_;
    fVar329 = auVar17._16_4_;
    fVar330 = auVar17._20_4_;
    fVar331 = auVar17._24_4_;
    fVar298 = auVar140._0_4_;
    fVar300 = auVar140._4_4_;
    fVar305 = auVar140._8_4_;
    fVar307 = auVar140._12_4_;
    fVar321 = auVar118._12_4_ + 1.0;
    fVar286 = auVar108._0_4_;
    fVar287 = auVar108._4_4_;
    fVar288 = auVar108._8_4_;
    fVar289 = auVar108._12_4_;
    fVar234 = fVar286 * auVar284._0_4_ + fVar318 * fVar217;
    fVar215 = fVar287 * auVar284._4_4_ + fVar319 * fVar231;
    fVar236 = fVar288 * auVar284._8_4_ + fVar320 * fVar232;
    fVar187 = fVar289 * auVar284._12_4_ + fVar322 * fVar233;
    fVar188 = fVar286 * auVar284._16_4_ + fVar329 * fVar217;
    fVar189 = fVar287 * auVar284._20_4_ + fVar330 * fVar231;
    fVar190 = fVar288 * auVar284._24_4_ + fVar331 * fVar232;
    fVar211 = auVar235._0_4_;
    fVar212 = auVar235._4_4_;
    fVar213 = auVar235._8_4_;
    fVar214 = auVar235._12_4_;
    fVar299 = fVar298 * fVar318 + auVar284._0_4_ * fVar211;
    fVar301 = fVar300 * fVar319 + auVar284._4_4_ * fVar212;
    fVar306 = fVar305 * fVar320 + auVar284._8_4_ * fVar213;
    fVar312 = fVar307 * fVar322 + auVar284._12_4_ * fVar214;
    fVar308 = fVar298 * fVar329 + auVar284._16_4_ * fVar211;
    fVar309 = fVar300 * fVar330 + auVar284._20_4_ * fVar212;
    fVar310 = fVar305 * fVar331 + auVar284._24_4_ * fVar213;
    fVar311 = fVar307 + fVar233;
    auVar23 = vshufps_avx(auVar160,auVar160,0xaa);
    auVar107 = vshufps_avx(auVar160,auVar160,0xff);
    fVar191 = fVar289 + 0.0;
    auVar140 = vshufps_avx(auVar136,auVar136,0xaa);
    auVar108 = vshufps_avx(auVar136,auVar136,0xff);
    auVar184._0_4_ =
         fVar318 * (auVar284._0_4_ * fVar217 + fVar318 * auVar150._0_4_) + auVar284._0_4_ * fVar234;
    auVar184._4_4_ =
         fVar319 * (auVar284._4_4_ * fVar231 + fVar319 * auVar150._4_4_) + auVar284._4_4_ * fVar215;
    auVar184._8_4_ =
         fVar320 * (auVar284._8_4_ * fVar232 + fVar320 * auVar150._8_4_) + auVar284._8_4_ * fVar236;
    auVar184._12_4_ =
         fVar322 * (auVar284._12_4_ * fVar233 + fVar322 * auVar150._12_4_) +
         auVar284._12_4_ * fVar187;
    auVar184._16_4_ =
         fVar329 * (auVar284._16_4_ * fVar217 + fVar329 * auVar150._0_4_) +
         auVar284._16_4_ * fVar188;
    auVar184._20_4_ =
         fVar330 * (auVar284._20_4_ * fVar231 + fVar330 * auVar150._4_4_) +
         auVar284._20_4_ * fVar189;
    auVar184._24_4_ =
         fVar331 * (auVar284._24_4_ * fVar232 + fVar331 * auVar150._8_4_) +
         auVar284._24_4_ * fVar190;
    auVar184._28_4_ = auVar150._12_4_ + 1.0 + fVar214;
    auVar209._0_4_ =
         fVar318 * (fVar298 * auVar284._0_4_ + auVar118._0_4_ * fVar318) + auVar284._0_4_ * fVar299;
    auVar209._4_4_ =
         fVar319 * (fVar300 * auVar284._4_4_ + auVar118._4_4_ * fVar319) + auVar284._4_4_ * fVar301;
    auVar209._8_4_ =
         fVar320 * (fVar305 * auVar284._8_4_ + auVar118._8_4_ * fVar320) + auVar284._8_4_ * fVar306;
    auVar209._12_4_ =
         fVar322 * (fVar307 * auVar284._12_4_ + auVar118._12_4_ * fVar322) +
         auVar284._12_4_ * fVar312;
    auVar209._16_4_ =
         fVar329 * (fVar298 * auVar284._16_4_ + auVar118._0_4_ * fVar329) +
         auVar284._16_4_ * fVar308;
    auVar209._20_4_ =
         fVar330 * (fVar300 * auVar284._20_4_ + auVar118._4_4_ * fVar330) +
         auVar284._20_4_ * fVar309;
    auVar209._24_4_ =
         fVar331 * (fVar305 * auVar284._24_4_ + auVar118._8_4_ * fVar331) +
         auVar284._24_4_ * fVar310;
    auVar209._28_4_ = auVar74._12_4_ + fVar214;
    auVar95._0_4_ =
         fVar318 * fVar234 + auVar284._0_4_ * (fVar286 * fVar318 + auVar9._0_4_ * auVar284._0_4_);
    auVar95._4_4_ =
         fVar319 * fVar215 + auVar284._4_4_ * (fVar287 * fVar319 + auVar9._4_4_ * auVar284._4_4_);
    auVar95._8_4_ =
         fVar320 * fVar236 + auVar284._8_4_ * (fVar288 * fVar320 + auVar9._8_4_ * auVar284._8_4_);
    auVar95._12_4_ =
         fVar322 * fVar187 + auVar284._12_4_ * (fVar289 * fVar322 + auVar9._12_4_ * auVar284._12_4_)
    ;
    auVar95._16_4_ =
         fVar329 * fVar188 + auVar284._16_4_ * (fVar286 * fVar329 + auVar9._0_4_ * auVar284._16_4_);
    auVar95._20_4_ =
         fVar330 * fVar189 + auVar284._20_4_ * (fVar287 * fVar330 + auVar9._4_4_ * auVar284._20_4_);
    auVar95._24_4_ =
         fVar331 * fVar190 + auVar284._24_4_ * (fVar288 * fVar331 + auVar9._8_4_ * auVar284._24_4_);
    auVar95._28_4_ = fVar233 + 1.0 + fVar191;
    auVar297._0_4_ =
         fVar318 * fVar299 + auVar284._0_4_ * (auVar74._0_4_ * auVar284._0_4_ + fVar318 * fVar211);
    auVar297._4_4_ =
         fVar319 * fVar301 + auVar284._4_4_ * (auVar74._4_4_ * auVar284._4_4_ + fVar319 * fVar212);
    auVar297._8_4_ =
         fVar320 * fVar306 + auVar284._8_4_ * (auVar74._8_4_ * auVar284._8_4_ + fVar320 * fVar213);
    auVar297._12_4_ =
         fVar322 * fVar312 +
         auVar284._12_4_ * (auVar74._12_4_ * auVar284._12_4_ + fVar322 * fVar214);
    auVar297._16_4_ =
         fVar329 * fVar308 + auVar284._16_4_ * (auVar74._0_4_ * auVar284._16_4_ + fVar329 * fVar211)
    ;
    auVar297._20_4_ =
         fVar330 * fVar309 + auVar284._20_4_ * (auVar74._4_4_ * auVar284._20_4_ + fVar330 * fVar212)
    ;
    auVar297._24_4_ =
         fVar331 * fVar310 + auVar284._24_4_ * (auVar74._8_4_ * auVar284._24_4_ + fVar331 * fVar213)
    ;
    auVar297._28_4_ = fVar191 + fVar214 + 0.0;
    local_b8._0_4_ = fVar318 * auVar184._0_4_ + auVar284._0_4_ * auVar95._0_4_;
    local_b8._4_4_ = fVar319 * auVar184._4_4_ + auVar284._4_4_ * auVar95._4_4_;
    local_b8._8_4_ = fVar320 * auVar184._8_4_ + auVar284._8_4_ * auVar95._8_4_;
    local_b8._12_4_ = fVar322 * auVar184._12_4_ + auVar284._12_4_ * auVar95._12_4_;
    local_b8._16_4_ = fVar329 * auVar184._16_4_ + auVar284._16_4_ * auVar95._16_4_;
    local_b8._20_4_ = fVar330 * auVar184._20_4_ + auVar284._20_4_ * auVar95._20_4_;
    local_b8._24_4_ = fVar331 * auVar184._24_4_ + auVar284._24_4_ * auVar95._24_4_;
    local_b8._28_4_ = fVar311 + fVar214 + 0.0;
    auVar167._0_4_ = fVar318 * auVar209._0_4_ + auVar284._0_4_ * auVar297._0_4_;
    auVar167._4_4_ = fVar319 * auVar209._4_4_ + auVar284._4_4_ * auVar297._4_4_;
    auVar167._8_4_ = fVar320 * auVar209._8_4_ + auVar284._8_4_ * auVar297._8_4_;
    auVar167._12_4_ = fVar322 * auVar209._12_4_ + auVar284._12_4_ * auVar297._12_4_;
    auVar167._16_4_ = fVar329 * auVar209._16_4_ + auVar284._16_4_ * auVar297._16_4_;
    auVar167._20_4_ = fVar330 * auVar209._20_4_ + auVar284._20_4_ * auVar297._20_4_;
    auVar167._24_4_ = fVar331 * auVar209._24_4_ + auVar284._24_4_ * auVar297._24_4_;
    auVar167._28_4_ = fVar311 + fVar191;
    auVar18 = vsubps_avx(auVar95,auVar184);
    auVar90 = vsubps_avx(auVar297,auVar209);
    local_4e8 = auVar79._0_4_;
    fStack_4e4 = auVar79._4_4_;
    fStack_4e0 = auVar79._8_4_;
    fStack_4dc = auVar79._12_4_;
    local_f8 = local_4e8 * auVar18._0_4_ * 3.0;
    fStack_f4 = fStack_4e4 * auVar18._4_4_ * 3.0;
    auVar26._4_4_ = fStack_f4;
    auVar26._0_4_ = local_f8;
    fStack_f0 = fStack_4e0 * auVar18._8_4_ * 3.0;
    auVar26._8_4_ = fStack_f0;
    fStack_ec = fStack_4dc * auVar18._12_4_ * 3.0;
    auVar26._12_4_ = fStack_ec;
    fStack_e8 = local_4e8 * auVar18._16_4_ * 3.0;
    auVar26._16_4_ = fStack_e8;
    fStack_e4 = fStack_4e4 * auVar18._20_4_ * 3.0;
    auVar26._20_4_ = fStack_e4;
    fStack_e0 = fStack_4e0 * auVar18._24_4_ * 3.0;
    auVar26._24_4_ = fStack_e0;
    auVar26._28_4_ = auVar18._28_4_;
    local_118 = local_4e8 * auVar90._0_4_ * 3.0;
    fStack_114 = fStack_4e4 * auVar90._4_4_ * 3.0;
    auVar27._4_4_ = fStack_114;
    auVar27._0_4_ = local_118;
    fStack_110 = fStack_4e0 * auVar90._8_4_ * 3.0;
    auVar27._8_4_ = fStack_110;
    fStack_10c = fStack_4dc * auVar90._12_4_ * 3.0;
    auVar27._12_4_ = fStack_10c;
    fStack_108 = local_4e8 * auVar90._16_4_ * 3.0;
    auVar27._16_4_ = fStack_108;
    fStack_104 = fStack_4e4 * auVar90._20_4_ * 3.0;
    auVar27._20_4_ = fStack_104;
    fStack_100 = fStack_4e0 * auVar90._24_4_ * 3.0;
    auVar27._24_4_ = fStack_100;
    auVar27._28_4_ = fVar311;
    auVar15 = vsubps_avx(local_b8,auVar26);
    auVar90 = vperm2f128_avx(auVar15,auVar15,1);
    auVar90 = vshufps_avx(auVar90,auVar15,0x30);
    auVar90 = vshufps_avx(auVar15,auVar90,0x29);
    auVar16 = vsubps_avx(auVar167,auVar27);
    auVar15 = vperm2f128_avx(auVar16,auVar16,1);
    auVar15 = vshufps_avx(auVar15,auVar16,0x30);
    auVar16 = vshufps_avx(auVar16,auVar15,0x29);
    fVar309 = auVar140._0_4_;
    fVar310 = auVar140._4_4_;
    fVar333 = auVar140._8_4_;
    fVar233 = auVar23._12_4_;
    fVar287 = auVar108._0_4_;
    fVar289 = auVar108._4_4_;
    fVar299 = auVar108._8_4_;
    fVar301 = auVar108._12_4_;
    auVar79 = vshufps_avx(auVar243,auVar243,0xaa);
    fVar217 = auVar79._0_4_;
    fVar231 = auVar79._4_4_;
    fVar232 = auVar79._8_4_;
    fVar214 = auVar79._12_4_;
    fVar236 = auVar284._0_4_ * fVar217 + fVar309 * fVar318;
    fVar187 = auVar284._4_4_ * fVar231 + fVar310 * fVar319;
    fVar188 = auVar284._8_4_ * fVar232 + fVar333 * fVar320;
    fVar189 = auVar284._12_4_ * fVar214 + auVar140._12_4_ * fVar322;
    fVar190 = auVar284._16_4_ * fVar217 + fVar309 * fVar329;
    fVar191 = auVar284._20_4_ * fVar231 + fVar310 * fVar330;
    fVar286 = auVar284._24_4_ * fVar232 + fVar333 * fVar331;
    auVar79 = vshufps_avx(auVar243,auVar243,0xff);
    fVar211 = auVar79._0_4_;
    fVar212 = auVar79._4_4_;
    fVar213 = auVar79._8_4_;
    fVar234 = auVar79._12_4_;
    fVar288 = auVar284._0_4_ * fVar211 + fVar287 * fVar318;
    fVar298 = auVar284._4_4_ * fVar212 + fVar289 * fVar319;
    fVar300 = auVar284._8_4_ * fVar213 + fVar299 * fVar320;
    fVar305 = auVar284._12_4_ * fVar234 + fVar301 * fVar322;
    fVar306 = auVar284._16_4_ * fVar211 + fVar287 * fVar329;
    fVar307 = auVar284._20_4_ * fVar212 + fVar289 * fVar330;
    fVar312 = auVar284._24_4_ * fVar213 + fVar299 * fVar331;
    auVar79 = vshufps_avx(auVar171,auVar171,0xaa);
    fVar308 = auVar79._12_4_ + fVar214;
    auVar150 = vshufps_avx(auVar171,auVar171,0xff);
    fVar215 = auVar150._12_4_;
    auVar96._0_4_ =
         fVar318 * (fVar309 * auVar284._0_4_ + fVar318 * auVar23._0_4_) + auVar284._0_4_ * fVar236;
    auVar96._4_4_ =
         fVar319 * (fVar310 * auVar284._4_4_ + fVar319 * auVar23._4_4_) + auVar284._4_4_ * fVar187;
    auVar96._8_4_ =
         fVar320 * (fVar333 * auVar284._8_4_ + fVar320 * auVar23._8_4_) + auVar284._8_4_ * fVar188;
    auVar96._12_4_ =
         fVar322 * (auVar140._12_4_ * auVar284._12_4_ + fVar322 * fVar233) +
         auVar284._12_4_ * fVar189;
    auVar96._16_4_ =
         fVar329 * (fVar309 * auVar284._16_4_ + fVar329 * auVar23._0_4_) + auVar284._16_4_ * fVar190
    ;
    auVar96._20_4_ =
         fVar330 * (fVar310 * auVar284._20_4_ + fVar330 * auVar23._4_4_) + auVar284._20_4_ * fVar191
    ;
    auVar96._24_4_ =
         fVar331 * (fVar333 * auVar284._24_4_ + fVar331 * auVar23._8_4_) + auVar284._24_4_ * fVar286
    ;
    auVar96._28_4_ = auVar16._28_4_ + fVar233 + fVar215;
    auVar128._0_4_ =
         fVar318 * (fVar287 * auVar284._0_4_ + auVar107._0_4_ * fVar318) + auVar284._0_4_ * fVar288;
    auVar128._4_4_ =
         fVar319 * (fVar289 * auVar284._4_4_ + auVar107._4_4_ * fVar319) + auVar284._4_4_ * fVar298;
    auVar128._8_4_ =
         fVar320 * (fVar299 * auVar284._8_4_ + auVar107._8_4_ * fVar320) + auVar284._8_4_ * fVar300;
    auVar128._12_4_ =
         fVar322 * (fVar301 * auVar284._12_4_ + auVar107._12_4_ * fVar322) +
         auVar284._12_4_ * fVar305;
    auVar128._16_4_ =
         fVar329 * (fVar287 * auVar284._16_4_ + auVar107._0_4_ * fVar329) +
         auVar284._16_4_ * fVar306;
    auVar128._20_4_ =
         fVar330 * (fVar289 * auVar284._20_4_ + auVar107._4_4_ * fVar330) +
         auVar284._20_4_ * fVar307;
    auVar128._24_4_ =
         fVar331 * (fVar299 * auVar284._24_4_ + auVar107._8_4_ * fVar331) +
         auVar284._24_4_ * fVar312;
    auVar128._28_4_ = fVar233 + auVar15._28_4_ + fVar215;
    auVar15 = vperm2f128_avx(local_b8,local_b8,1);
    auVar15 = vshufps_avx(auVar15,local_b8,0x30);
    _local_3f8 = vshufps_avx(local_b8,auVar15,0x29);
    auVar210._0_4_ =
         auVar284._0_4_ * (auVar79._0_4_ * auVar284._0_4_ + fVar318 * fVar217) + fVar318 * fVar236;
    auVar210._4_4_ =
         auVar284._4_4_ * (auVar79._4_4_ * auVar284._4_4_ + fVar319 * fVar231) + fVar319 * fVar187;
    auVar210._8_4_ =
         auVar284._8_4_ * (auVar79._8_4_ * auVar284._8_4_ + fVar320 * fVar232) + fVar320 * fVar188;
    auVar210._12_4_ =
         auVar284._12_4_ * (auVar79._12_4_ * auVar284._12_4_ + fVar322 * fVar214) +
         fVar322 * fVar189;
    auVar210._16_4_ =
         auVar284._16_4_ * (auVar79._0_4_ * auVar284._16_4_ + fVar329 * fVar217) + fVar329 * fVar190
    ;
    auVar210._20_4_ =
         auVar284._20_4_ * (auVar79._4_4_ * auVar284._20_4_ + fVar330 * fVar231) + fVar330 * fVar191
    ;
    auVar210._24_4_ =
         auVar284._24_4_ * (auVar79._8_4_ * auVar284._24_4_ + fVar331 * fVar232) + fVar331 * fVar286
    ;
    auVar210._28_4_ = fVar308 + fVar321 + auVar209._28_4_;
    auVar262._0_4_ =
         fVar318 * fVar288 + auVar284._0_4_ * (auVar284._0_4_ * auVar150._0_4_ + fVar318 * fVar211);
    auVar262._4_4_ =
         fVar319 * fVar298 + auVar284._4_4_ * (auVar284._4_4_ * auVar150._4_4_ + fVar319 * fVar212);
    auVar262._8_4_ =
         fVar320 * fVar300 + auVar284._8_4_ * (auVar284._8_4_ * auVar150._8_4_ + fVar320 * fVar213);
    auVar262._12_4_ =
         fVar322 * fVar305 + auVar284._12_4_ * (auVar284._12_4_ * fVar215 + fVar322 * fVar234);
    auVar262._16_4_ =
         fVar329 * fVar306 +
         auVar284._16_4_ * (auVar284._16_4_ * auVar150._0_4_ + fVar329 * fVar211);
    auVar262._20_4_ =
         fVar330 * fVar307 +
         auVar284._20_4_ * (auVar284._20_4_ * auVar150._4_4_ + fVar330 * fVar212);
    auVar262._24_4_ =
         fVar331 * fVar312 +
         auVar284._24_4_ * (auVar284._24_4_ * auVar150._8_4_ + fVar331 * fVar213);
    auVar262._28_4_ = fVar321 + fVar301 + fVar215 + fVar234;
    auVar251._0_4_ = fVar318 * auVar96._0_4_ + auVar284._0_4_ * auVar210._0_4_;
    auVar251._4_4_ = fVar319 * auVar96._4_4_ + auVar284._4_4_ * auVar210._4_4_;
    auVar251._8_4_ = fVar320 * auVar96._8_4_ + auVar284._8_4_ * auVar210._8_4_;
    auVar251._12_4_ = fVar322 * auVar96._12_4_ + auVar284._12_4_ * auVar210._12_4_;
    auVar251._16_4_ = fVar329 * auVar96._16_4_ + auVar284._16_4_ * auVar210._16_4_;
    auVar251._20_4_ = fVar330 * auVar96._20_4_ + auVar284._20_4_ * auVar210._20_4_;
    auVar251._24_4_ = fVar331 * auVar96._24_4_ + auVar284._24_4_ * auVar210._24_4_;
    auVar251._28_4_ = fVar308 + fVar215 + fVar234;
    auVar276._0_4_ = fVar318 * auVar128._0_4_ + auVar284._0_4_ * auVar262._0_4_;
    auVar276._4_4_ = fVar319 * auVar128._4_4_ + auVar284._4_4_ * auVar262._4_4_;
    auVar276._8_4_ = fVar320 * auVar128._8_4_ + auVar284._8_4_ * auVar262._8_4_;
    auVar276._12_4_ = fVar322 * auVar128._12_4_ + auVar284._12_4_ * auVar262._12_4_;
    auVar276._16_4_ = fVar329 * auVar128._16_4_ + auVar284._16_4_ * auVar262._16_4_;
    auVar276._20_4_ = fVar330 * auVar128._20_4_ + auVar284._20_4_ * auVar262._20_4_;
    auVar276._24_4_ = fVar331 * auVar128._24_4_ + auVar284._24_4_ * auVar262._24_4_;
    auVar276._28_4_ = auVar17._28_4_ + auVar284._28_4_;
    auVar21 = vsubps_avx(auVar210,auVar96);
    auVar15 = vsubps_avx(auVar262,auVar128);
    local_138 = local_4e8 * auVar21._0_4_ * 3.0;
    fStack_134 = fStack_4e4 * auVar21._4_4_ * 3.0;
    auVar28._4_4_ = fStack_134;
    auVar28._0_4_ = local_138;
    fStack_130 = fStack_4e0 * auVar21._8_4_ * 3.0;
    auVar28._8_4_ = fStack_130;
    fStack_12c = fStack_4dc * auVar21._12_4_ * 3.0;
    auVar28._12_4_ = fStack_12c;
    fStack_128 = local_4e8 * auVar21._16_4_ * 3.0;
    auVar28._16_4_ = fStack_128;
    fStack_124 = fStack_4e4 * auVar21._20_4_ * 3.0;
    auVar28._20_4_ = fStack_124;
    fStack_120 = fStack_4e0 * auVar21._24_4_ * 3.0;
    auVar28._24_4_ = fStack_120;
    auVar28._28_4_ = auVar21._28_4_;
    local_158 = local_4e8 * auVar15._0_4_ * 3.0;
    fStack_154 = fStack_4e4 * auVar15._4_4_ * 3.0;
    auVar29._4_4_ = fStack_154;
    auVar29._0_4_ = local_158;
    fStack_150 = fStack_4e0 * auVar15._8_4_ * 3.0;
    auVar29._8_4_ = fStack_150;
    fStack_14c = fStack_4dc * auVar15._12_4_ * 3.0;
    auVar29._12_4_ = fStack_14c;
    fStack_148 = local_4e8 * auVar15._16_4_ * 3.0;
    auVar29._16_4_ = fStack_148;
    fStack_144 = fStack_4e4 * auVar15._20_4_ * 3.0;
    auVar29._20_4_ = fStack_144;
    fStack_140 = fStack_4e0 * auVar15._24_4_ * 3.0;
    auVar29._24_4_ = fStack_140;
    auVar29._28_4_ = auVar210._28_4_;
    auVar15 = vperm2f128_avx(auVar251,auVar251,1);
    auVar15 = vshufps_avx(auVar15,auVar251,0x30);
    auVar19 = vshufps_avx(auVar251,auVar15,0x29);
    auVar17 = vsubps_avx(auVar251,auVar28);
    auVar15 = vperm2f128_avx(auVar17,auVar17,1);
    auVar15 = vshufps_avx(auVar15,auVar17,0x30);
    auVar15 = vshufps_avx(auVar17,auVar15,0x29);
    auVar20 = vsubps_avx(auVar276,auVar29);
    auVar17 = vperm2f128_avx(auVar20,auVar20,1);
    auVar17 = vshufps_avx(auVar17,auVar20,0x30);
    auVar20 = vshufps_avx(auVar20,auVar17,0x29);
    auVar22 = vsubps_avx(auVar251,local_b8);
    auVar24 = vsubps_avx(auVar19,_local_3f8);
    fVar217 = auVar24._0_4_ + auVar22._0_4_;
    fVar211 = auVar24._4_4_ + auVar22._4_4_;
    fVar231 = auVar24._8_4_ + auVar22._8_4_;
    fVar212 = auVar24._12_4_ + auVar22._12_4_;
    fVar232 = auVar24._16_4_ + auVar22._16_4_;
    fVar213 = auVar24._20_4_ + auVar22._20_4_;
    fVar233 = auVar24._24_4_ + auVar22._24_4_;
    auVar17 = vperm2f128_avx(auVar167,auVar167,1);
    auVar17 = vshufps_avx(auVar17,auVar167,0x30);
    local_d8 = vshufps_avx(auVar167,auVar17,0x29);
    auVar17 = vperm2f128_avx(auVar276,auVar276,1);
    auVar17 = vshufps_avx(auVar17,auVar276,0x30);
    local_98 = vshufps_avx(auVar276,auVar17,0x29);
    auVar17 = vsubps_avx(auVar276,auVar167);
    auVar25 = vsubps_avx(local_98,local_d8);
    fVar214 = auVar25._0_4_ + auVar17._0_4_;
    fVar234 = auVar25._4_4_ + auVar17._4_4_;
    fVar215 = auVar25._8_4_ + auVar17._8_4_;
    fVar236 = auVar25._12_4_ + auVar17._12_4_;
    fVar187 = auVar25._16_4_ + auVar17._16_4_;
    fVar188 = auVar25._20_4_ + auVar17._20_4_;
    fVar189 = auVar25._24_4_ + auVar17._24_4_;
    auVar30._4_4_ = fVar211 * auVar167._4_4_;
    auVar30._0_4_ = fVar217 * auVar167._0_4_;
    auVar30._8_4_ = fVar231 * auVar167._8_4_;
    auVar30._12_4_ = fVar212 * auVar167._12_4_;
    auVar30._16_4_ = fVar232 * auVar167._16_4_;
    auVar30._20_4_ = fVar213 * auVar167._20_4_;
    auVar30._24_4_ = fVar233 * auVar167._24_4_;
    auVar30._28_4_ = auVar17._28_4_;
    auVar31._4_4_ = fVar234 * local_b8._4_4_;
    auVar31._0_4_ = fVar214 * local_b8._0_4_;
    auVar31._8_4_ = fVar215 * local_b8._8_4_;
    auVar31._12_4_ = fVar236 * local_b8._12_4_;
    auVar31._16_4_ = fVar187 * local_b8._16_4_;
    auVar31._20_4_ = fVar188 * local_b8._20_4_;
    auVar31._24_4_ = fVar189 * local_b8._24_4_;
    auVar31._28_4_ = fVar308;
    auVar91 = vsubps_avx(auVar30,auVar31);
    local_f8 = local_b8._0_4_ + local_f8;
    fStack_f4 = local_b8._4_4_ + fStack_f4;
    fStack_f0 = local_b8._8_4_ + fStack_f0;
    fStack_ec = local_b8._12_4_ + fStack_ec;
    fStack_e8 = local_b8._16_4_ + fStack_e8;
    fStack_e4 = local_b8._20_4_ + fStack_e4;
    fStack_e0 = local_b8._24_4_ + fStack_e0;
    fStack_dc = local_b8._28_4_ + auVar18._28_4_;
    local_118 = local_118 + auVar167._0_4_;
    fStack_114 = fStack_114 + auVar167._4_4_;
    fStack_110 = fStack_110 + auVar167._8_4_;
    fStack_10c = fStack_10c + auVar167._12_4_;
    fStack_108 = fStack_108 + auVar167._16_4_;
    fStack_104 = fStack_104 + auVar167._20_4_;
    fStack_100 = fStack_100 + auVar167._24_4_;
    fStack_fc = fVar311 + auVar167._28_4_;
    auVar32._4_4_ = fVar211 * fStack_114;
    auVar32._0_4_ = fVar217 * local_118;
    auVar32._8_4_ = fVar231 * fStack_110;
    auVar32._12_4_ = fVar212 * fStack_10c;
    auVar32._16_4_ = fVar232 * fStack_108;
    auVar32._20_4_ = fVar213 * fStack_104;
    auVar32._24_4_ = fVar233 * fStack_100;
    auVar32._28_4_ = fVar311;
    auVar33._4_4_ = fVar234 * fStack_f4;
    auVar33._0_4_ = fVar214 * local_f8;
    auVar33._8_4_ = fVar215 * fStack_f0;
    auVar33._12_4_ = fVar236 * fStack_ec;
    auVar33._16_4_ = fVar187 * fStack_e8;
    auVar33._20_4_ = fVar188 * fStack_e4;
    auVar33._24_4_ = fVar189 * fStack_e0;
    auVar33._28_4_ = fVar311 + auVar167._28_4_;
    auVar18 = vsubps_avx(auVar32,auVar33);
    local_538._0_4_ = auVar16._0_4_;
    local_538._4_4_ = auVar16._4_4_;
    fStack_530 = auVar16._8_4_;
    fStack_52c = auVar16._12_4_;
    fStack_528 = auVar16._16_4_;
    fStack_524 = auVar16._20_4_;
    fStack_520 = auVar16._24_4_;
    auVar34._4_4_ = fVar211 * (float)local_538._4_4_;
    auVar34._0_4_ = fVar217 * (float)local_538._0_4_;
    auVar34._8_4_ = fVar231 * fStack_530;
    auVar34._12_4_ = fVar212 * fStack_52c;
    auVar34._16_4_ = fVar232 * fStack_528;
    auVar34._20_4_ = fVar213 * fStack_524;
    auVar34._24_4_ = fVar233 * fStack_520;
    auVar34._28_4_ = fVar311;
    local_5a8._0_4_ = auVar90._0_4_;
    local_5a8._4_4_ = auVar90._4_4_;
    fStack_5a0 = auVar90._8_4_;
    fStack_59c = auVar90._12_4_;
    fStack_598 = auVar90._16_4_;
    fStack_594 = auVar90._20_4_;
    fStack_590 = auVar90._24_4_;
    auVar35._4_4_ = fVar234 * (float)local_5a8._4_4_;
    auVar35._0_4_ = fVar214 * (float)local_5a8._0_4_;
    auVar35._8_4_ = fVar215 * fStack_5a0;
    auVar35._12_4_ = fVar236 * fStack_59c;
    auVar35._16_4_ = fVar187 * fStack_598;
    auVar35._20_4_ = fVar188 * fStack_594;
    auVar35._24_4_ = fVar189 * fStack_590;
    auVar35._28_4_ = local_b8._28_4_;
    auVar92 = vsubps_avx(auVar34,auVar35);
    auVar36._4_4_ = local_d8._4_4_ * fVar211;
    auVar36._0_4_ = local_d8._0_4_ * fVar217;
    auVar36._8_4_ = local_d8._8_4_ * fVar231;
    auVar36._12_4_ = local_d8._12_4_ * fVar212;
    auVar36._16_4_ = local_d8._16_4_ * fVar232;
    auVar36._20_4_ = local_d8._20_4_ * fVar213;
    auVar36._24_4_ = local_d8._24_4_ * fVar233;
    auVar36._28_4_ = fVar311;
    auVar37._4_4_ = local_3f8._4_4_ * fVar234;
    auVar37._0_4_ = local_3f8._0_4_ * fVar214;
    auVar37._8_4_ = local_3f8._8_4_ * fVar215;
    auVar37._12_4_ = local_3f8._12_4_ * fVar236;
    auVar37._16_4_ = local_3f8._16_4_ * fVar187;
    auVar37._20_4_ = local_3f8._20_4_ * fVar188;
    auVar37._24_4_ = local_3f8._24_4_ * fVar189;
    auVar37._28_4_ = local_d8._28_4_;
    local_4e8 = auVar15._0_4_;
    fStack_4e4 = auVar15._4_4_;
    fStack_4e0 = auVar15._8_4_;
    fStack_4dc = auVar15._12_4_;
    fStack_4d8 = auVar15._16_4_;
    fStack_4d4 = auVar15._20_4_;
    fStack_4d0 = auVar15._24_4_;
    auVar124 = vsubps_avx(auVar36,auVar37);
    auVar38._4_4_ = auVar276._4_4_ * fVar211;
    auVar38._0_4_ = auVar276._0_4_ * fVar217;
    auVar38._8_4_ = auVar276._8_4_ * fVar231;
    auVar38._12_4_ = auVar276._12_4_ * fVar212;
    auVar38._16_4_ = auVar276._16_4_ * fVar232;
    auVar38._20_4_ = auVar276._20_4_ * fVar213;
    auVar38._24_4_ = auVar276._24_4_ * fVar233;
    auVar38._28_4_ = fVar311;
    auVar39._4_4_ = fVar234 * auVar251._4_4_;
    auVar39._0_4_ = fVar214 * auVar251._0_4_;
    auVar39._8_4_ = fVar215 * auVar251._8_4_;
    auVar39._12_4_ = fVar236 * auVar251._12_4_;
    auVar39._16_4_ = fVar187 * auVar251._16_4_;
    auVar39._20_4_ = fVar188 * auVar251._20_4_;
    auVar39._24_4_ = fVar189 * auVar251._24_4_;
    auVar39._28_4_ = fStack_dc;
    auVar125 = vsubps_avx(auVar38,auVar39);
    local_138 = auVar251._0_4_ + local_138;
    fStack_134 = auVar251._4_4_ + fStack_134;
    fStack_130 = auVar251._8_4_ + fStack_130;
    fStack_12c = auVar251._12_4_ + fStack_12c;
    fStack_128 = auVar251._16_4_ + fStack_128;
    fStack_124 = auVar251._20_4_ + fStack_124;
    fStack_120 = auVar251._24_4_ + fStack_120;
    fStack_11c = auVar251._28_4_ + auVar21._28_4_;
    local_158 = auVar276._0_4_ + local_158;
    fStack_154 = auVar276._4_4_ + fStack_154;
    fStack_150 = auVar276._8_4_ + fStack_150;
    fStack_14c = auVar276._12_4_ + fStack_14c;
    fStack_148 = auVar276._16_4_ + fStack_148;
    fStack_144 = auVar276._20_4_ + fStack_144;
    fStack_140 = auVar276._24_4_ + fStack_140;
    fStack_13c = auVar276._28_4_ + auVar210._28_4_;
    auVar40._4_4_ = fVar211 * fStack_154;
    auVar40._0_4_ = fVar217 * local_158;
    auVar40._8_4_ = fVar231 * fStack_150;
    auVar40._12_4_ = fVar212 * fStack_14c;
    auVar40._16_4_ = fVar232 * fStack_148;
    auVar40._20_4_ = fVar213 * fStack_144;
    auVar40._24_4_ = fVar233 * fStack_140;
    auVar40._28_4_ = auVar276._28_4_ + auVar210._28_4_;
    auVar41._4_4_ = fStack_134 * fVar234;
    auVar41._0_4_ = local_138 * fVar214;
    auVar41._8_4_ = fStack_130 * fVar215;
    auVar41._12_4_ = fStack_12c * fVar236;
    auVar41._16_4_ = fStack_128 * fVar187;
    auVar41._20_4_ = fStack_124 * fVar188;
    auVar41._24_4_ = fStack_120 * fVar189;
    auVar41._28_4_ = fStack_11c;
    auVar21 = vsubps_avx(auVar40,auVar41);
    auVar42._4_4_ = fVar211 * auVar20._4_4_;
    auVar42._0_4_ = fVar217 * auVar20._0_4_;
    auVar42._8_4_ = fVar231 * auVar20._8_4_;
    auVar42._12_4_ = fVar212 * auVar20._12_4_;
    auVar42._16_4_ = fVar232 * auVar20._16_4_;
    auVar42._20_4_ = fVar213 * auVar20._20_4_;
    auVar42._24_4_ = fVar233 * auVar20._24_4_;
    auVar42._28_4_ = fStack_11c;
    auVar43._4_4_ = fVar234 * fStack_4e4;
    auVar43._0_4_ = fVar214 * local_4e8;
    auVar43._8_4_ = fVar215 * fStack_4e0;
    auVar43._12_4_ = fVar236 * fStack_4dc;
    auVar43._16_4_ = fVar187 * fStack_4d8;
    auVar43._20_4_ = fVar188 * fStack_4d4;
    auVar43._24_4_ = fVar189 * fStack_4d0;
    auVar43._28_4_ = auVar20._28_4_;
    auVar126 = vsubps_avx(auVar42,auVar43);
    auVar44._4_4_ = fVar211 * local_98._4_4_;
    auVar44._0_4_ = fVar217 * local_98._0_4_;
    auVar44._8_4_ = fVar231 * local_98._8_4_;
    auVar44._12_4_ = fVar212 * local_98._12_4_;
    auVar44._16_4_ = fVar232 * local_98._16_4_;
    auVar44._20_4_ = fVar213 * local_98._20_4_;
    auVar44._24_4_ = fVar233 * local_98._24_4_;
    auVar44._28_4_ = auVar24._28_4_ + auVar22._28_4_;
    auVar45._4_4_ = auVar19._4_4_ * fVar234;
    auVar45._0_4_ = auVar19._0_4_ * fVar214;
    auVar45._8_4_ = auVar19._8_4_ * fVar215;
    auVar45._12_4_ = auVar19._12_4_ * fVar236;
    auVar45._16_4_ = auVar19._16_4_ * fVar187;
    auVar45._20_4_ = auVar19._20_4_ * fVar188;
    auVar45._24_4_ = auVar19._24_4_ * fVar189;
    auVar45._28_4_ = auVar25._28_4_ + auVar17._28_4_;
    auVar22 = vsubps_avx(auVar44,auVar45);
    auVar15 = vminps_avx(auVar91,auVar18);
    auVar90 = vmaxps_avx(auVar91,auVar18);
    auVar16 = vminps_avx(auVar92,auVar124);
    auVar16 = vminps_avx(auVar15,auVar16);
    auVar15 = vmaxps_avx(auVar92,auVar124);
    auVar90 = vmaxps_avx(auVar90,auVar15);
    auVar17 = vminps_avx(auVar125,auVar21);
    auVar15 = vmaxps_avx(auVar125,auVar21);
    auVar18 = vminps_avx(auVar126,auVar22);
    auVar18 = vminps_avx(auVar17,auVar18);
    auVar18 = vminps_avx(auVar16,auVar18);
    auVar16 = vmaxps_avx(auVar126,auVar22);
    auVar15 = vmaxps_avx(auVar15,auVar16);
    auVar15 = vmaxps_avx(auVar90,auVar15);
    auVar90 = vcmpps_avx(auVar18,local_78,2);
    auVar15 = vcmpps_avx(auVar15,local_268,5);
    auVar90 = vandps_avx(auVar15,auVar90);
    auVar15 = local_178 & auVar90;
    if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar15 >> 0x7f,0) != '\0') ||
          (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar15 >> 0xbf,0) != '\0') ||
        (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar15[0x1f] < '\0')
    {
      auVar15 = vsubps_avx(_local_3f8,local_b8);
      auVar16 = vsubps_avx(auVar19,auVar251);
      fVar211 = auVar15._0_4_ + auVar16._0_4_;
      fVar231 = auVar15._4_4_ + auVar16._4_4_;
      fVar212 = auVar15._8_4_ + auVar16._8_4_;
      fVar232 = auVar15._12_4_ + auVar16._12_4_;
      fVar213 = auVar15._16_4_ + auVar16._16_4_;
      fVar233 = auVar15._20_4_ + auVar16._20_4_;
      fVar214 = auVar15._24_4_ + auVar16._24_4_;
      auVar18 = vsubps_avx(local_d8,auVar167);
      auVar21 = vsubps_avx(local_98,auVar276);
      fVar234 = auVar18._0_4_ + auVar21._0_4_;
      fVar215 = auVar18._4_4_ + auVar21._4_4_;
      fVar236 = auVar18._8_4_ + auVar21._8_4_;
      fVar187 = auVar18._12_4_ + auVar21._12_4_;
      fVar188 = auVar18._16_4_ + auVar21._16_4_;
      fVar189 = auVar18._20_4_ + auVar21._20_4_;
      fVar190 = auVar18._24_4_ + auVar21._24_4_;
      fVar217 = auVar21._28_4_;
      auVar46._4_4_ = auVar167._4_4_ * fVar231;
      auVar46._0_4_ = auVar167._0_4_ * fVar211;
      auVar46._8_4_ = auVar167._8_4_ * fVar212;
      auVar46._12_4_ = auVar167._12_4_ * fVar232;
      auVar46._16_4_ = auVar167._16_4_ * fVar213;
      auVar46._20_4_ = auVar167._20_4_ * fVar233;
      auVar46._24_4_ = auVar167._24_4_ * fVar214;
      auVar46._28_4_ = auVar167._28_4_;
      auVar47._4_4_ = local_b8._4_4_ * fVar215;
      auVar47._0_4_ = local_b8._0_4_ * fVar234;
      auVar47._8_4_ = local_b8._8_4_ * fVar236;
      auVar47._12_4_ = local_b8._12_4_ * fVar187;
      auVar47._16_4_ = local_b8._16_4_ * fVar188;
      auVar47._20_4_ = local_b8._20_4_ * fVar189;
      auVar47._24_4_ = local_b8._24_4_ * fVar190;
      auVar47._28_4_ = local_b8._28_4_;
      auVar21 = vsubps_avx(auVar46,auVar47);
      auVar48._4_4_ = fVar231 * fStack_114;
      auVar48._0_4_ = fVar211 * local_118;
      auVar48._8_4_ = fVar212 * fStack_110;
      auVar48._12_4_ = fVar232 * fStack_10c;
      auVar48._16_4_ = fVar213 * fStack_108;
      auVar48._20_4_ = fVar233 * fStack_104;
      auVar48._24_4_ = fVar214 * fStack_100;
      auVar48._28_4_ = auVar167._28_4_;
      auVar49._4_4_ = fVar215 * fStack_f4;
      auVar49._0_4_ = fVar234 * local_f8;
      auVar49._8_4_ = fVar236 * fStack_f0;
      auVar49._12_4_ = fVar187 * fStack_ec;
      auVar49._16_4_ = fVar188 * fStack_e8;
      auVar49._20_4_ = fVar189 * fStack_e4;
      auVar49._24_4_ = fVar190 * fStack_e0;
      auVar49._28_4_ = fVar217;
      auVar22 = vsubps_avx(auVar48,auVar49);
      auVar50._4_4_ = fVar231 * (float)local_538._4_4_;
      auVar50._0_4_ = fVar211 * (float)local_538._0_4_;
      auVar50._8_4_ = fVar212 * fStack_530;
      auVar50._12_4_ = fVar232 * fStack_52c;
      auVar50._16_4_ = fVar213 * fStack_528;
      auVar50._20_4_ = fVar233 * fStack_524;
      auVar50._24_4_ = fVar214 * fStack_520;
      auVar50._28_4_ = fVar217;
      auVar51._4_4_ = fVar215 * (float)local_5a8._4_4_;
      auVar51._0_4_ = fVar234 * (float)local_5a8._0_4_;
      auVar51._8_4_ = fVar236 * fStack_5a0;
      auVar51._12_4_ = fVar187 * fStack_59c;
      auVar51._16_4_ = fVar188 * fStack_598;
      auVar51._20_4_ = fVar189 * fStack_594;
      auVar51._24_4_ = fVar190 * fStack_590;
      auVar51._28_4_ = auVar17._28_4_;
      auVar24 = vsubps_avx(auVar50,auVar51);
      auVar52._4_4_ = local_d8._4_4_ * fVar231;
      auVar52._0_4_ = local_d8._0_4_ * fVar211;
      auVar52._8_4_ = local_d8._8_4_ * fVar212;
      auVar52._12_4_ = local_d8._12_4_ * fVar232;
      auVar52._16_4_ = local_d8._16_4_ * fVar213;
      auVar52._20_4_ = local_d8._20_4_ * fVar233;
      auVar52._24_4_ = local_d8._24_4_ * fVar214;
      auVar52._28_4_ = auVar17._28_4_;
      auVar53._4_4_ = local_3f8._4_4_ * fVar215;
      auVar53._0_4_ = local_3f8._0_4_ * fVar234;
      auVar53._8_4_ = local_3f8._8_4_ * fVar236;
      auVar53._12_4_ = local_3f8._12_4_ * fVar187;
      auVar53._16_4_ = local_3f8._16_4_ * fVar188;
      auVar53._20_4_ = local_3f8._20_4_ * fVar189;
      uVar4 = local_3f8._28_4_;
      auVar53._24_4_ = local_3f8._24_4_ * fVar190;
      auVar53._28_4_ = uVar4;
      auVar25 = vsubps_avx(auVar52,auVar53);
      auVar54._4_4_ = auVar276._4_4_ * fVar231;
      auVar54._0_4_ = auVar276._0_4_ * fVar211;
      auVar54._8_4_ = auVar276._8_4_ * fVar212;
      auVar54._12_4_ = auVar276._12_4_ * fVar232;
      auVar54._16_4_ = auVar276._16_4_ * fVar213;
      auVar54._20_4_ = auVar276._20_4_ * fVar233;
      auVar54._24_4_ = auVar276._24_4_ * fVar214;
      auVar54._28_4_ = uVar4;
      auVar55._4_4_ = auVar251._4_4_ * fVar215;
      auVar55._0_4_ = auVar251._0_4_ * fVar234;
      auVar55._8_4_ = auVar251._8_4_ * fVar236;
      auVar55._12_4_ = auVar251._12_4_ * fVar187;
      auVar55._16_4_ = auVar251._16_4_ * fVar188;
      auVar55._20_4_ = auVar251._20_4_ * fVar189;
      auVar55._24_4_ = auVar251._24_4_ * fVar190;
      auVar55._28_4_ = auVar251._28_4_;
      auVar91 = vsubps_avx(auVar54,auVar55);
      auVar56._4_4_ = fVar231 * fStack_154;
      auVar56._0_4_ = fVar211 * local_158;
      auVar56._8_4_ = fVar212 * fStack_150;
      auVar56._12_4_ = fVar232 * fStack_14c;
      auVar56._16_4_ = fVar213 * fStack_148;
      auVar56._20_4_ = fVar233 * fStack_144;
      auVar56._24_4_ = fVar214 * fStack_140;
      auVar56._28_4_ = uVar4;
      auVar57._4_4_ = fVar215 * fStack_134;
      auVar57._0_4_ = fVar234 * local_138;
      auVar57._8_4_ = fVar236 * fStack_130;
      auVar57._12_4_ = fVar187 * fStack_12c;
      auVar57._16_4_ = fVar188 * fStack_128;
      auVar57._20_4_ = fVar189 * fStack_124;
      auVar57._24_4_ = fVar190 * fStack_120;
      auVar57._28_4_ = auVar276._28_4_;
      auVar92 = vsubps_avx(auVar56,auVar57);
      auVar58._4_4_ = fVar231 * auVar20._4_4_;
      auVar58._0_4_ = fVar211 * auVar20._0_4_;
      auVar58._8_4_ = fVar212 * auVar20._8_4_;
      auVar58._12_4_ = fVar232 * auVar20._12_4_;
      auVar58._16_4_ = fVar213 * auVar20._16_4_;
      auVar58._20_4_ = fVar233 * auVar20._20_4_;
      auVar58._24_4_ = fVar214 * auVar20._24_4_;
      auVar58._28_4_ = auVar276._28_4_;
      auVar59._4_4_ = fStack_4e4 * fVar215;
      auVar59._0_4_ = local_4e8 * fVar234;
      auVar59._8_4_ = fStack_4e0 * fVar236;
      auVar59._12_4_ = fStack_4dc * fVar187;
      auVar59._16_4_ = fStack_4d8 * fVar188;
      auVar59._20_4_ = fStack_4d4 * fVar189;
      auVar59._24_4_ = fStack_4d0 * fVar190;
      auVar59._28_4_ = local_d8._28_4_;
      auVar20 = vsubps_avx(auVar58,auVar59);
      auVar60._4_4_ = local_98._4_4_ * fVar231;
      auVar60._0_4_ = local_98._0_4_ * fVar211;
      auVar60._8_4_ = local_98._8_4_ * fVar212;
      auVar60._12_4_ = local_98._12_4_ * fVar232;
      auVar60._16_4_ = local_98._16_4_ * fVar213;
      auVar60._20_4_ = local_98._20_4_ * fVar233;
      auVar60._24_4_ = local_98._24_4_ * fVar214;
      auVar60._28_4_ = auVar15._28_4_ + auVar16._28_4_;
      auVar61._4_4_ = auVar19._4_4_ * fVar215;
      auVar61._0_4_ = auVar19._0_4_ * fVar234;
      auVar61._8_4_ = auVar19._8_4_ * fVar236;
      auVar61._12_4_ = auVar19._12_4_ * fVar187;
      auVar61._16_4_ = auVar19._16_4_ * fVar188;
      auVar61._20_4_ = auVar19._20_4_ * fVar189;
      auVar61._24_4_ = auVar19._24_4_ * fVar190;
      auVar61._28_4_ = auVar18._28_4_ + fVar217;
      auVar124 = vsubps_avx(auVar60,auVar61);
      auVar16 = vminps_avx(auVar21,auVar22);
      auVar15 = vmaxps_avx(auVar21,auVar22);
      auVar17 = vminps_avx(auVar24,auVar25);
      auVar17 = vminps_avx(auVar16,auVar17);
      auVar16 = vmaxps_avx(auVar24,auVar25);
      auVar15 = vmaxps_avx(auVar15,auVar16);
      auVar18 = vminps_avx(auVar91,auVar92);
      auVar16 = vmaxps_avx(auVar91,auVar92);
      auVar19 = vminps_avx(auVar20,auVar124);
      auVar18 = vminps_avx(auVar18,auVar19);
      auVar18 = vminps_avx(auVar17,auVar18);
      auVar17 = vmaxps_avx(auVar20,auVar124);
      auVar16 = vmaxps_avx(auVar16,auVar17);
      auVar16 = vmaxps_avx(auVar15,auVar16);
      auVar15 = vcmpps_avx(auVar18,local_78,2);
      auVar16 = vcmpps_avx(auVar16,local_268,5);
      auVar15 = vandps_avx(auVar16,auVar15);
      auVar90 = vandps_avx(local_178,auVar90);
      auVar16 = auVar90 & auVar15;
      if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar16 >> 0x7f,0) != '\0') ||
            (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar16 >> 0xbf,0) != '\0') ||
          (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar16[0x1f] < '\0') {
        auVar90 = vandps_avx(auVar15,auVar90);
        uVar70 = vmovmskps_avx(auVar90);
        if (uVar70 != 0) {
          uVar68 = (ulong)uVar69;
          auStack_3d8[uVar68] = uVar70 & 0xff;
          uVar5 = vmovlps_avx(local_328);
          *(undefined8 *)(afStack_248 + uVar68 * 2) = uVar5;
          uVar66 = vmovlps_avx(auVar100);
          auStack_58[uVar68] = uVar66;
          uVar69 = uVar69 + 1;
        }
      }
    }
LAB_0106771e:
    do {
      do {
        do {
          do {
            if (uVar69 == 0) {
              if (bVar64) {
                return bVar64;
              }
              uVar4 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar99._4_4_ = uVar4;
              auVar99._0_4_ = uVar4;
              auVar99._8_4_ = uVar4;
              auVar99._12_4_ = uVar4;
              auVar99._16_4_ = uVar4;
              auVar99._20_4_ = uVar4;
              auVar99._24_4_ = uVar4;
              auVar99._28_4_ = uVar4;
              auVar90 = vcmpps_avx(local_198,auVar99,2);
              uVar67 = vmovmskps_avx(auVar90);
              uVar65 = uVar65 & uVar65 + 0xff & uVar67;
              if (uVar65 == 0) {
                return bVar64;
              }
              goto LAB_01066902;
            }
            uVar68 = (ulong)(uVar69 - 1);
            uVar70 = auStack_3d8[uVar68];
            fVar217 = afStack_248[uVar68 * 2];
            fVar211 = afStack_248[uVar68 * 2 + 1];
            auVar268._8_8_ = 0;
            auVar268._0_8_ = auStack_58[uVar68];
            auVar277 = ZEXT1664(auVar268);
            uVar66 = 0;
            if (uVar70 != 0) {
              for (; (uVar70 >> uVar66 & 1) == 0; uVar66 = uVar66 + 1) {
              }
            }
            uVar70 = uVar70 - 1 & uVar70;
            auStack_3d8[uVar68] = uVar70;
            if (uVar70 == 0) {
              uVar69 = uVar69 - 1;
            }
            fVar212 = (float)(uVar66 + 1) * 0.14285715;
            fVar231 = (1.0 - (float)uVar66 * 0.14285715) * fVar217 +
                      fVar211 * (float)uVar66 * 0.14285715;
            fVar217 = (1.0 - fVar212) * fVar217 + fVar211 * fVar212;
            fVar211 = fVar217 - fVar231;
            if (0.16666667 <= fVar211) {
              auVar79 = vinsertps_avx(ZEXT416((uint)fVar231),ZEXT416((uint)fVar217),0x10);
              auVar285 = ZEXT1664(auVar79);
              goto LAB_010670c2;
            }
            auVar79 = vshufps_avx(auVar268,auVar268,0x50);
            auVar105._8_4_ = 0x3f800000;
            auVar105._0_8_ = 0x3f8000003f800000;
            auVar105._12_4_ = 0x3f800000;
            auVar23 = vsubps_avx(auVar105,auVar79);
            fVar212 = auVar79._0_4_;
            fVar232 = auVar79._4_4_;
            fVar213 = auVar79._8_4_;
            fVar233 = auVar79._12_4_;
            fVar214 = auVar23._0_4_;
            fVar234 = auVar23._4_4_;
            fVar215 = auVar23._8_4_;
            fVar236 = auVar23._12_4_;
            auVar137._0_4_ = fVar212 * auVar323._0_4_ + fVar214 * fVar216;
            auVar137._4_4_ = fVar232 * auVar323._4_4_ + fVar234 * fVar168;
            auVar137._8_4_ = fVar213 * auVar323._0_4_ + fVar215 * fVar216;
            auVar137._12_4_ = fVar233 * auVar323._4_4_ + fVar236 * fVar168;
            auVar172._0_4_ = auVar257._0_4_ * fVar212 + fVar237 * fVar214;
            auVar172._4_4_ = auVar257._4_4_ * fVar232 + fVar186 * fVar234;
            auVar172._8_4_ = auVar257._0_4_ * fVar213 + fVar237 * fVar215;
            auVar172._12_4_ = auVar257._4_4_ * fVar233 + fVar186 * fVar236;
            auVar200._0_4_ = auVar267._0_4_ * fVar212 + auVar302._0_4_ * fVar214;
            auVar200._4_4_ = auVar267._4_4_ * fVar232 + auVar302._4_4_ * fVar234;
            auVar200._8_4_ = auVar267._0_4_ * fVar213 + auVar302._0_4_ * fVar215;
            auVar200._12_4_ = auVar267._4_4_ * fVar233 + auVar302._4_4_ * fVar236;
            auVar76._0_4_ = auVar104._0_4_ * fVar212 + auVar313._0_4_ * fVar214;
            auVar76._4_4_ = auVar104._4_4_ * fVar232 + auVar313._4_4_ * fVar234;
            auVar76._8_4_ = auVar104._0_4_ * fVar213 + auVar313._0_4_ * fVar215;
            auVar76._12_4_ = auVar104._4_4_ * fVar233 + auVar313._4_4_ * fVar236;
            auVar129._16_16_ = auVar137;
            auVar129._0_16_ = auVar137;
            auVar156._16_16_ = auVar172;
            auVar156._0_16_ = auVar172;
            auVar185._16_16_ = auVar200;
            auVar185._0_16_ = auVar200;
            auVar90 = ZEXT2032(CONCAT416(fVar217,ZEXT416((uint)fVar231)));
            auVar90 = vshufps_avx(auVar90,auVar90,0);
            auVar15 = vsubps_avx(auVar156,auVar129);
            fVar212 = auVar90._0_4_;
            fVar232 = auVar90._4_4_;
            fVar213 = auVar90._8_4_;
            fVar233 = auVar90._12_4_;
            fVar214 = auVar90._16_4_;
            fVar234 = auVar90._20_4_;
            fVar215 = auVar90._24_4_;
            auVar130._0_4_ = auVar137._0_4_ + auVar15._0_4_ * fVar212;
            auVar130._4_4_ = auVar137._4_4_ + auVar15._4_4_ * fVar232;
            auVar130._8_4_ = auVar137._8_4_ + auVar15._8_4_ * fVar213;
            auVar130._12_4_ = auVar137._12_4_ + auVar15._12_4_ * fVar233;
            auVar130._16_4_ = auVar137._0_4_ + auVar15._16_4_ * fVar214;
            auVar130._20_4_ = auVar137._4_4_ + auVar15._20_4_ * fVar234;
            auVar130._24_4_ = auVar137._8_4_ + auVar15._24_4_ * fVar215;
            auVar130._28_4_ = auVar137._12_4_ + auVar15._28_4_;
            auVar90 = vsubps_avx(auVar185,auVar156);
            auVar157._0_4_ = auVar172._0_4_ + auVar90._0_4_ * fVar212;
            auVar157._4_4_ = auVar172._4_4_ + auVar90._4_4_ * fVar232;
            auVar157._8_4_ = auVar172._8_4_ + auVar90._8_4_ * fVar213;
            auVar157._12_4_ = auVar172._12_4_ + auVar90._12_4_ * fVar233;
            auVar157._16_4_ = auVar172._0_4_ + auVar90._16_4_ * fVar214;
            auVar157._20_4_ = auVar172._4_4_ + auVar90._20_4_ * fVar234;
            auVar157._24_4_ = auVar172._8_4_ + auVar90._24_4_ * fVar215;
            auVar157._28_4_ = auVar172._12_4_ + auVar90._28_4_;
            auVar79 = vsubps_avx(auVar76,auVar200);
            auVar97._0_4_ = auVar200._0_4_ + auVar79._0_4_ * fVar212;
            auVar97._4_4_ = auVar200._4_4_ + auVar79._4_4_ * fVar232;
            auVar97._8_4_ = auVar200._8_4_ + auVar79._8_4_ * fVar213;
            auVar97._12_4_ = auVar200._12_4_ + auVar79._12_4_ * fVar233;
            auVar97._16_4_ = auVar200._0_4_ + auVar79._0_4_ * fVar214;
            auVar97._20_4_ = auVar200._4_4_ + auVar79._4_4_ * fVar234;
            auVar97._24_4_ = auVar200._8_4_ + auVar79._8_4_ * fVar215;
            auVar97._28_4_ = auVar200._12_4_ + auVar79._12_4_;
            auVar90 = vsubps_avx(auVar157,auVar130);
            auVar131._0_4_ = auVar130._0_4_ + fVar212 * auVar90._0_4_;
            auVar131._4_4_ = auVar130._4_4_ + fVar232 * auVar90._4_4_;
            auVar131._8_4_ = auVar130._8_4_ + fVar213 * auVar90._8_4_;
            auVar131._12_4_ = auVar130._12_4_ + fVar233 * auVar90._12_4_;
            auVar131._16_4_ = auVar130._16_4_ + fVar214 * auVar90._16_4_;
            auVar131._20_4_ = auVar130._20_4_ + fVar234 * auVar90._20_4_;
            auVar131._24_4_ = auVar130._24_4_ + fVar215 * auVar90._24_4_;
            auVar131._28_4_ = auVar130._28_4_ + auVar90._28_4_;
            auVar90 = vsubps_avx(auVar97,auVar157);
            auVar98._0_4_ = auVar157._0_4_ + fVar212 * auVar90._0_4_;
            auVar98._4_4_ = auVar157._4_4_ + fVar232 * auVar90._4_4_;
            auVar98._8_4_ = auVar157._8_4_ + fVar213 * auVar90._8_4_;
            auVar98._12_4_ = auVar157._12_4_ + fVar233 * auVar90._12_4_;
            auVar98._16_4_ = auVar157._16_4_ + fVar214 * auVar90._16_4_;
            auVar98._20_4_ = auVar157._20_4_ + fVar234 * auVar90._20_4_;
            auVar98._24_4_ = auVar157._24_4_ + fVar215 * auVar90._24_4_;
            auVar98._28_4_ = auVar157._28_4_ + auVar90._28_4_;
            auVar90 = vsubps_avx(auVar98,auVar131);
            auVar224._0_4_ = auVar131._0_4_ + fVar212 * auVar90._0_4_;
            auVar224._4_4_ = auVar131._4_4_ + fVar232 * auVar90._4_4_;
            auVar224._8_4_ = auVar131._8_4_ + fVar213 * auVar90._8_4_;
            auVar224._12_4_ = auVar131._12_4_ + fVar233 * auVar90._12_4_;
            auVar230._16_4_ = auVar131._16_4_ + fVar214 * auVar90._16_4_;
            auVar230._0_16_ = auVar224;
            auVar230._20_4_ = auVar131._20_4_ + fVar234 * auVar90._20_4_;
            auVar230._24_4_ = auVar131._24_4_ + fVar215 * auVar90._24_4_;
            auVar230._28_4_ = auVar131._28_4_ + auVar157._28_4_;
            auVar235 = auVar230._16_16_;
            auVar107 = vshufps_avx(ZEXT416((uint)(fVar211 * 0.33333334)),
                                   ZEXT416((uint)(fVar211 * 0.33333334)),0);
            auVar201._0_4_ = auVar224._0_4_ + auVar107._0_4_ * auVar90._0_4_ * 3.0;
            auVar201._4_4_ = auVar224._4_4_ + auVar107._4_4_ * auVar90._4_4_ * 3.0;
            auVar201._8_4_ = auVar224._8_4_ + auVar107._8_4_ * auVar90._8_4_ * 3.0;
            auVar201._12_4_ = auVar224._12_4_ + auVar107._12_4_ * auVar90._12_4_ * 3.0;
            auVar150 = vshufpd_avx(auVar224,auVar224,3);
            auVar118 = vshufpd_avx(auVar235,auVar235,3);
            _local_3f8 = auVar150;
            auVar79 = vsubps_avx(auVar150,auVar224);
            auVar23 = vsubps_avx(auVar118,auVar235);
            auVar77._0_4_ = auVar79._0_4_ + auVar23._0_4_;
            auVar77._4_4_ = auVar79._4_4_ + auVar23._4_4_;
            auVar77._8_4_ = auVar79._8_4_ + auVar23._8_4_;
            auVar77._12_4_ = auVar79._12_4_ + auVar23._12_4_;
            auVar79 = vmovshdup_avx(auVar224);
            auVar23 = vmovshdup_avx(auVar201);
            auVar140 = vshufps_avx(auVar77,auVar77,0);
            auVar108 = vshufps_avx(auVar77,auVar77,0x55);
            fVar212 = auVar108._0_4_;
            fVar232 = auVar108._4_4_;
            fVar213 = auVar108._8_4_;
            fVar233 = auVar108._12_4_;
            fVar214 = auVar140._0_4_;
            fVar234 = auVar140._4_4_;
            fVar215 = auVar140._8_4_;
            fVar236 = auVar140._12_4_;
            auVar78._0_4_ = fVar214 * auVar224._0_4_ + auVar79._0_4_ * fVar212;
            auVar78._4_4_ = fVar234 * auVar224._4_4_ + auVar79._4_4_ * fVar232;
            auVar78._8_4_ = fVar215 * auVar224._8_4_ + auVar79._8_4_ * fVar213;
            auVar78._12_4_ = fVar236 * auVar224._12_4_ + auVar79._12_4_ * fVar233;
            auVar138._0_4_ = fVar214 * auVar201._0_4_ + auVar23._0_4_ * fVar212;
            auVar138._4_4_ = fVar234 * auVar201._4_4_ + auVar23._4_4_ * fVar232;
            auVar138._8_4_ = fVar215 * auVar201._8_4_ + auVar23._8_4_ * fVar213;
            auVar138._12_4_ = fVar236 * auVar201._12_4_ + auVar23._12_4_ * fVar233;
            auVar23 = vshufps_avx(auVar78,auVar78,0xe8);
            auVar140 = vshufps_avx(auVar138,auVar138,0xe8);
            auVar79 = vcmpps_avx(auVar23,auVar140,1);
            uVar70 = vextractps_avx(auVar79,0);
            auVar108 = auVar138;
            if ((uVar70 & 1) == 0) {
              auVar108 = auVar78;
            }
            auVar106._0_4_ = auVar107._0_4_ * auVar90._16_4_ * 3.0;
            auVar106._4_4_ = auVar107._4_4_ * auVar90._20_4_ * 3.0;
            auVar106._8_4_ = auVar107._8_4_ * auVar90._24_4_ * 3.0;
            auVar106._12_4_ = auVar107._12_4_ * 0.0;
            auVar74 = vsubps_avx(auVar235,auVar106);
            auVar107 = vmovshdup_avx(auVar74);
            auVar235 = vmovshdup_avx(auVar235);
            fVar187 = auVar74._0_4_;
            fVar188 = auVar74._4_4_;
            auVar173._0_4_ = fVar187 * fVar214 + auVar107._0_4_ * fVar212;
            auVar173._4_4_ = fVar188 * fVar234 + auVar107._4_4_ * fVar232;
            auVar173._8_4_ = auVar74._8_4_ * fVar215 + auVar107._8_4_ * fVar213;
            auVar173._12_4_ = auVar74._12_4_ * fVar236 + auVar107._12_4_ * fVar233;
            auVar202._0_4_ = fVar214 * auVar230._16_4_ + auVar235._0_4_ * fVar212;
            auVar202._4_4_ = fVar234 * auVar230._20_4_ + auVar235._4_4_ * fVar232;
            auVar202._8_4_ = fVar215 * auVar230._24_4_ + auVar235._8_4_ * fVar213;
            auVar202._12_4_ = fVar236 * auVar230._28_4_ + auVar235._12_4_ * fVar233;
            auVar235 = vshufps_avx(auVar173,auVar173,0xe8);
            auVar9 = vshufps_avx(auVar202,auVar202,0xe8);
            auVar107 = vcmpps_avx(auVar235,auVar9,1);
            uVar70 = vextractps_avx(auVar107,0);
            auVar100 = auVar202;
            if ((uVar70 & 1) == 0) {
              auVar100 = auVar173;
            }
            auVar108 = vmaxss_avx(auVar100,auVar108);
            auVar23 = vminps_avx(auVar23,auVar140);
            auVar140 = vminps_avx(auVar235,auVar9);
            auVar140 = vminps_avx(auVar23,auVar140);
            auVar79 = vshufps_avx(auVar79,auVar79,0x55);
            auVar79 = vblendps_avx(auVar79,auVar107,2);
            auVar107 = vpslld_avx(auVar79,0x1f);
            auVar79 = vshufpd_avx(auVar138,auVar138,1);
            auVar79 = vinsertps_avx(auVar79,auVar202,0x9c);
            auVar23 = vshufpd_avx(auVar78,auVar78,1);
            auVar23 = vinsertps_avx(auVar23,auVar173,0x9c);
            auVar79 = vblendvps_avx(auVar23,auVar79,auVar107);
            auVar23 = vmovshdup_avx(auVar79);
            auVar79 = vmaxss_avx(auVar23,auVar79);
            fVar213 = auVar140._0_4_;
            auVar23 = vmovshdup_avx(auVar140);
            fVar232 = auVar79._0_4_;
            fVar233 = auVar23._0_4_;
            fVar212 = auVar108._0_4_;
            if ((fVar213 < 0.0001) && (-0.0001 < fVar232)) break;
            if ((fVar233 < 0.0001 && -0.0001 < fVar212) || (fVar213 < 0.0001 && -0.0001 < fVar212))
            break;
            auVar107 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar79,1);
            auVar23 = vcmpps_avx(auVar23,SUB6416(ZEXT464(0x38d1b717),0),1);
            auVar23 = vandps_avx(auVar23,auVar107);
          } while ((auVar23 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
          auVar107 = vcmpps_avx(auVar140,_DAT_01f7aa10,1);
          auVar23 = vcmpss_avx(auVar108,ZEXT416(0),1);
          auVar139._8_4_ = 0x3f800000;
          auVar139._0_8_ = 0x3f8000003f800000;
          auVar139._12_4_ = 0x3f800000;
          auVar174._8_4_ = 0xbf800000;
          auVar174._0_8_ = 0xbf800000bf800000;
          auVar174._12_4_ = 0xbf800000;
          auVar23 = vblendvps_avx(auVar139,auVar174,auVar23);
          auVar107 = vblendvps_avx(auVar139,auVar174,auVar107);
          auVar140 = vcmpss_avx(auVar107,auVar23,4);
          auVar140 = vpshufd_avx(ZEXT416(auVar140._0_4_ & 1),0x50);
          auVar140 = vpslld_avx(auVar140,0x1f);
          auVar140 = vpsrad_avx(auVar140,0x1f);
          auVar140 = vpandn_avx(auVar140,_DAT_01fafeb0);
          auVar108 = vmovshdup_avx(auVar107);
          fVar214 = auVar108._0_4_;
          local_548 = auVar6._0_4_;
          fStack_544 = auVar6._4_4_;
          fStack_540 = auVar6._8_4_;
          fStack_53c = auVar6._12_4_;
          if ((auVar107._0_4_ != fVar214) || (NAN(auVar107._0_4_) || NAN(fVar214))) {
            if ((fVar233 != fVar213) || (NAN(fVar233) || NAN(fVar213))) {
              fVar213 = -fVar213 / (fVar233 - fVar213);
              auVar107 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar213) * 0.0 + fVar213)));
            }
            else {
              auVar107 = ZEXT816(0x3f80000000000000);
              if ((fVar213 != 0.0) || (NAN(fVar213))) {
                auVar107 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar235 = vcmpps_avx(auVar140,auVar107,1);
            auVar108 = vblendps_avx(auVar140,auVar107,2);
            auVar107 = vblendps_avx(auVar107,auVar140,2);
            auVar140 = vblendvps_avx(auVar107,auVar108,auVar235);
          }
          auVar79 = vcmpss_avx(auVar79,ZEXT416(0),1);
          auVar141._8_4_ = 0x3f800000;
          auVar141._0_8_ = 0x3f8000003f800000;
          auVar141._12_4_ = 0x3f800000;
          auVar175._8_4_ = 0xbf800000;
          auVar175._0_8_ = 0xbf800000bf800000;
          auVar175._12_4_ = 0xbf800000;
          auVar79 = vblendvps_avx(auVar141,auVar175,auVar79);
          fVar213 = auVar79._0_4_;
          if ((auVar23._0_4_ != fVar213) || (NAN(auVar23._0_4_) || NAN(fVar213))) {
            if ((fVar232 != fVar212) || (NAN(fVar232) || NAN(fVar212))) {
              fVar212 = -fVar212 / (fVar232 - fVar212);
              auVar79 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar212) * 0.0 + fVar212)));
            }
            else {
              auVar79 = ZEXT816(0x3f80000000000000);
              if ((fVar212 != 0.0) || (NAN(fVar212))) {
                auVar79 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar107 = vcmpps_avx(auVar140,auVar79,1);
            auVar23 = vblendps_avx(auVar140,auVar79,2);
            auVar79 = vblendps_avx(auVar79,auVar140,2);
            auVar140 = vblendvps_avx(auVar79,auVar23,auVar107);
          }
          if ((fVar214 != fVar213) || (NAN(fVar214) || NAN(fVar213))) {
            auVar80._8_4_ = 0x3f800000;
            auVar80._0_8_ = 0x3f8000003f800000;
            auVar80._12_4_ = 0x3f800000;
            auVar79 = vcmpps_avx(auVar140,auVar80,1);
            auVar23 = vinsertps_avx(auVar140,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar142._4_12_ = auVar140._4_12_;
            auVar142._0_4_ = 0x3f800000;
            auVar140 = vblendvps_avx(auVar142,auVar23,auVar79);
          }
          auVar79 = vcmpps_avx(auVar140,_DAT_01f7b6f0,1);
          auVar62._12_4_ = 0;
          auVar62._0_12_ = auVar140._4_12_;
          auVar23 = vinsertps_avx(auVar140,ZEXT416(0x3f800000),0x10);
          auVar79 = vblendvps_avx(auVar23,auVar62 << 0x20,auVar79);
          auVar23 = vmovshdup_avx(auVar79);
        } while (auVar23._0_4_ < auVar79._0_4_);
        auVar81._0_4_ = auVar79._0_4_ + -0.1;
        auVar81._4_4_ = auVar79._4_4_ + 0.1;
        auVar81._8_4_ = auVar79._8_4_ + 0.0;
        auVar81._12_4_ = auVar79._12_4_ + 0.0;
        auVar107 = vshufpd_avx(auVar201,auVar201,3);
        auVar225._8_8_ = 0x3f80000000000000;
        auVar225._0_8_ = 0x3f80000000000000;
        auVar79 = vcmpps_avx(auVar81,auVar225,1);
        auVar63._12_4_ = 0;
        auVar63._0_12_ = auVar81._4_12_;
        auVar23 = vinsertps_avx(auVar81,SUB6416(ZEXT464(0x3f800000),0),0x10);
        auVar79 = vblendvps_avx(auVar23,auVar63 << 0x20,auVar79);
        auVar23 = vshufpd_avx(auVar74,auVar74,3);
        auVar140 = vshufps_avx(auVar79,auVar79,0x50);
        auVar226._8_4_ = 0x3f800000;
        auVar226._0_8_ = 0x3f8000003f800000;
        auVar226._12_4_ = 0x3f800000;
        auVar108 = vsubps_avx(auVar226,auVar140);
        local_3f8._0_4_ = auVar150._0_4_;
        local_3f8._4_4_ = auVar150._4_4_;
        fStack_3f0 = auVar150._8_4_;
        fStack_3ec = auVar150._12_4_;
        fVar212 = auVar140._0_4_;
        fVar232 = auVar140._4_4_;
        fVar213 = auVar140._8_4_;
        fVar233 = auVar140._12_4_;
        local_568 = auVar118._0_4_;
        fStack_564 = auVar118._4_4_;
        fStack_560 = auVar118._8_4_;
        fStack_55c = auVar118._12_4_;
        fVar214 = auVar108._0_4_;
        fVar234 = auVar108._4_4_;
        fVar215 = auVar108._8_4_;
        fVar236 = auVar108._12_4_;
        auVar82._0_4_ = fVar212 * (float)local_3f8._0_4_ + fVar214 * auVar224._0_4_;
        auVar82._4_4_ = fVar232 * (float)local_3f8._4_4_ + fVar234 * auVar224._4_4_;
        auVar82._8_4_ = fVar213 * fStack_3f0 + fVar215 * auVar224._0_4_;
        auVar82._12_4_ = fVar233 * fStack_3ec + fVar236 * auVar224._4_4_;
        auVar143._0_4_ = fVar212 * auVar107._0_4_ + fVar214 * auVar201._0_4_;
        auVar143._4_4_ = fVar232 * auVar107._4_4_ + fVar234 * auVar201._4_4_;
        auVar143._8_4_ = fVar213 * auVar107._8_4_ + fVar215 * auVar201._0_4_;
        auVar143._12_4_ = fVar233 * auVar107._12_4_ + fVar236 * auVar201._4_4_;
        auVar203._0_4_ = fVar212 * auVar23._0_4_ + fVar214 * fVar187;
        auVar203._4_4_ = fVar232 * auVar23._4_4_ + fVar234 * fVar188;
        auVar203._8_4_ = fVar213 * auVar23._8_4_ + fVar215 * fVar187;
        auVar203._12_4_ = fVar233 * auVar23._12_4_ + fVar236 * fVar188;
        auVar244._0_4_ = fVar212 * local_568 + fVar214 * auVar230._16_4_;
        auVar244._4_4_ = fVar232 * fStack_564 + fVar234 * auVar230._20_4_;
        auVar244._8_4_ = fVar213 * fStack_560 + fVar215 * auVar230._16_4_;
        auVar244._12_4_ = fVar233 * fStack_55c + fVar236 * auVar230._20_4_;
        auVar118 = vsubps_avx(auVar226,auVar79);
        auVar23 = vmovshdup_avx(auVar268);
        auVar150 = vmovsldup_avx(auVar268);
        auVar227._0_4_ = auVar150._0_4_ * auVar118._0_4_ + auVar79._0_4_ * auVar23._0_4_;
        auVar227._4_4_ = auVar150._4_4_ * auVar118._4_4_ + auVar79._4_4_ * auVar23._4_4_;
        auVar227._8_4_ = auVar150._8_4_ * auVar118._8_4_ + auVar79._8_4_ * auVar23._8_4_;
        auVar227._12_4_ = auVar150._12_4_ * auVar118._12_4_ + auVar79._12_4_ * auVar23._12_4_;
        auVar74 = vmovshdup_avx(auVar227);
        auVar79 = vsubps_avx(auVar143,auVar82);
        auVar161._0_4_ = auVar79._0_4_ * 3.0;
        auVar161._4_4_ = auVar79._4_4_ * 3.0;
        auVar161._8_4_ = auVar79._8_4_ * 3.0;
        auVar161._12_4_ = auVar79._12_4_ * 3.0;
        auVar79 = vsubps_avx(auVar203,auVar143);
        auVar258._0_4_ = auVar79._0_4_ * 3.0;
        auVar258._4_4_ = auVar79._4_4_ * 3.0;
        auVar258._8_4_ = auVar79._8_4_ * 3.0;
        auVar258._12_4_ = auVar79._12_4_ * 3.0;
        auVar79 = vsubps_avx(auVar244,auVar203);
        auVar269._0_4_ = auVar79._0_4_ * 3.0;
        auVar269._4_4_ = auVar79._4_4_ * 3.0;
        auVar269._8_4_ = auVar79._8_4_ * 3.0;
        auVar269._12_4_ = auVar79._12_4_ * 3.0;
        auVar23 = vminps_avx(auVar258,auVar269);
        auVar79 = vmaxps_avx(auVar258,auVar269);
        auVar23 = vminps_avx(auVar161,auVar23);
        auVar79 = vmaxps_avx(auVar161,auVar79);
        auVar150 = vshufpd_avx(auVar23,auVar23,3);
        auVar118 = vshufpd_avx(auVar79,auVar79,3);
        auVar23 = vminps_avx(auVar23,auVar150);
        auVar79 = vmaxps_avx(auVar79,auVar118);
        auVar150 = vshufps_avx(ZEXT416((uint)(1.0 / fVar211)),ZEXT416((uint)(1.0 / fVar211)),0);
        auVar259._0_4_ = auVar23._0_4_ * auVar150._0_4_;
        auVar259._4_4_ = auVar23._4_4_ * auVar150._4_4_;
        auVar259._8_4_ = auVar23._8_4_ * auVar150._8_4_;
        auVar259._12_4_ = auVar23._12_4_ * auVar150._12_4_;
        auVar270._0_4_ = auVar150._0_4_ * auVar79._0_4_;
        auVar270._4_4_ = auVar150._4_4_ * auVar79._4_4_;
        auVar270._8_4_ = auVar150._8_4_ * auVar79._8_4_;
        auVar270._12_4_ = auVar150._12_4_ * auVar79._12_4_;
        auVar108 = ZEXT416((uint)(1.0 / (auVar74._0_4_ - auVar227._0_4_)));
        auVar79 = vshufpd_avx(auVar82,auVar82,3);
        auVar23 = vshufpd_avx(auVar143,auVar143,3);
        auVar150 = vshufpd_avx(auVar203,auVar203,3);
        auVar118 = vshufpd_avx(auVar244,auVar244,3);
        auVar79 = vsubps_avx(auVar79,auVar82);
        auVar107 = vsubps_avx(auVar23,auVar143);
        auVar140 = vsubps_avx(auVar150,auVar203);
        auVar118 = vsubps_avx(auVar118,auVar244);
        auVar23 = vminps_avx(auVar79,auVar107);
        auVar79 = vmaxps_avx(auVar79,auVar107);
        auVar150 = vminps_avx(auVar140,auVar118);
        auVar150 = vminps_avx(auVar23,auVar150);
        auVar23 = vmaxps_avx(auVar140,auVar118);
        auVar79 = vmaxps_avx(auVar79,auVar23);
        auVar23 = vshufps_avx(auVar108,auVar108,0);
        auVar314._0_4_ = auVar23._0_4_ * auVar150._0_4_;
        auVar314._4_4_ = auVar23._4_4_ * auVar150._4_4_;
        auVar314._8_4_ = auVar23._8_4_ * auVar150._8_4_;
        auVar314._12_4_ = auVar23._12_4_ * auVar150._12_4_;
        auVar325._0_4_ = auVar23._0_4_ * auVar79._0_4_;
        auVar325._4_4_ = auVar23._4_4_ * auVar79._4_4_;
        auVar325._8_4_ = auVar23._8_4_ * auVar79._8_4_;
        auVar325._12_4_ = auVar23._12_4_ * auVar79._12_4_;
        auVar79 = vmovsldup_avx(auVar227);
        auVar280._4_12_ = auVar79._4_12_;
        auVar280._0_4_ = fVar231;
        auVar291._4_12_ = auVar227._4_12_;
        auVar291._0_4_ = fVar217;
        auVar162._0_4_ = (fVar231 + fVar217) * 0.5;
        auVar162._4_4_ = (auVar79._4_4_ + auVar227._4_4_) * 0.5;
        auVar162._8_4_ = (auVar79._8_4_ + auVar227._8_4_) * 0.5;
        auVar162._12_4_ = (auVar79._12_4_ + auVar227._12_4_) * 0.5;
        auVar79 = vshufps_avx(auVar162,auVar162,0);
        fVar212 = auVar79._0_4_;
        fVar232 = auVar79._4_4_;
        fVar213 = auVar79._8_4_;
        fVar233 = auVar79._12_4_;
        auVar109._0_4_ = local_548 + fVar212 * (float)local_278._0_4_;
        auVar109._4_4_ = fStack_544 + fVar232 * (float)local_278._4_4_;
        auVar109._8_4_ = fStack_540 + fVar213 * fStack_270;
        auVar109._12_4_ = fStack_53c + fVar233 * fStack_26c;
        local_4b8 = auVar7._0_4_;
        fStack_4b4 = auVar7._4_4_;
        fStack_4b0 = auVar7._8_4_;
        fStack_4ac = auVar7._12_4_;
        auVar144._0_4_ = fVar212 * (float)local_288._0_4_ + local_4b8;
        auVar144._4_4_ = fVar232 * (float)local_288._4_4_ + fStack_4b4;
        auVar144._8_4_ = fVar213 * fStack_280 + fStack_4b0;
        auVar144._12_4_ = fVar233 * fStack_27c + fStack_4ac;
        local_4c8 = auVar8._0_4_;
        fStack_4c4 = auVar8._4_4_;
        fStack_4c0 = auVar8._8_4_;
        fStack_4bc = auVar8._12_4_;
        auVar204._0_4_ = fVar212 * (float)local_298._0_4_ + local_4c8;
        auVar204._4_4_ = fVar232 * (float)local_298._4_4_ + fStack_4c4;
        auVar204._8_4_ = fVar213 * fStack_290 + fStack_4c0;
        auVar204._12_4_ = fVar233 * fStack_28c + fStack_4bc;
        auVar79 = vsubps_avx(auVar144,auVar109);
        auVar110._0_4_ = auVar109._0_4_ + fVar212 * auVar79._0_4_;
        auVar110._4_4_ = auVar109._4_4_ + fVar232 * auVar79._4_4_;
        auVar110._8_4_ = auVar109._8_4_ + fVar213 * auVar79._8_4_;
        auVar110._12_4_ = auVar109._12_4_ + fVar233 * auVar79._12_4_;
        auVar79 = vsubps_avx(auVar204,auVar144);
        auVar145._0_4_ = auVar144._0_4_ + fVar212 * auVar79._0_4_;
        auVar145._4_4_ = auVar144._4_4_ + fVar232 * auVar79._4_4_;
        auVar145._8_4_ = auVar144._8_4_ + fVar213 * auVar79._8_4_;
        auVar145._12_4_ = auVar144._12_4_ + fVar233 * auVar79._12_4_;
        auVar79 = vsubps_avx(auVar145,auVar110);
        fVar212 = auVar110._0_4_ + fVar212 * auVar79._0_4_;
        fVar232 = auVar110._4_4_ + fVar232 * auVar79._4_4_;
        auVar83._0_8_ = CONCAT44(fVar232,fVar212);
        auVar83._8_4_ = auVar110._8_4_ + fVar213 * auVar79._8_4_;
        auVar83._12_4_ = auVar110._12_4_ + fVar233 * auVar79._12_4_;
        fVar213 = auVar79._0_4_ * 3.0;
        fVar233 = auVar79._4_4_ * 3.0;
        auVar111._0_8_ = CONCAT44(fVar233,fVar213);
        auVar111._8_4_ = auVar79._8_4_ * 3.0;
        auVar111._12_4_ = auVar79._12_4_ * 3.0;
        auVar146._8_8_ = auVar83._0_8_;
        auVar146._0_8_ = auVar83._0_8_;
        auVar79 = vshufpd_avx(auVar83,auVar83,3);
        auVar23 = vshufps_avx(auVar162,auVar162,0x55);
        auVar140 = vsubps_avx(auVar79,auVar146);
        auVar303._0_4_ = auVar140._0_4_ * auVar23._0_4_ + fVar212;
        auVar303._4_4_ = auVar140._4_4_ * auVar23._4_4_ + fVar232;
        auVar303._8_4_ = auVar140._8_4_ * auVar23._8_4_ + fVar212;
        auVar303._12_4_ = auVar140._12_4_ * auVar23._12_4_ + fVar232;
        auVar147._8_8_ = auVar111._0_8_;
        auVar147._0_8_ = auVar111._0_8_;
        auVar79 = vshufpd_avx(auVar111,auVar111,1);
        auVar79 = vsubps_avx(auVar79,auVar147);
        auVar112._0_4_ = auVar79._0_4_ * auVar23._0_4_ + fVar213;
        auVar112._4_4_ = auVar79._4_4_ * auVar23._4_4_ + fVar233;
        auVar112._8_4_ = auVar79._8_4_ * auVar23._8_4_ + fVar213;
        auVar112._12_4_ = auVar79._12_4_ * auVar23._12_4_ + fVar233;
        auVar23 = vmovshdup_avx(auVar112);
        auVar205._0_8_ = auVar23._0_8_ ^ 0x8000000080000000;
        auVar205._8_4_ = auVar23._8_4_ ^ 0x80000000;
        auVar205._12_4_ = auVar23._12_4_ ^ 0x80000000;
        auVar150 = vmovshdup_avx(auVar140);
        auVar79 = vunpcklps_avx(auVar150,auVar205);
        auVar118 = vshufps_avx(auVar79,auVar205,4);
        auVar84._0_8_ = auVar140._0_8_ ^ 0x8000000080000000;
        auVar84._8_4_ = -auVar140._8_4_;
        auVar84._12_4_ = -auVar140._12_4_;
        auVar79 = vmovlhps_avx(auVar84,auVar112);
        auVar107 = vshufps_avx(auVar79,auVar112,8);
        auVar79 = ZEXT416((uint)(auVar112._0_4_ * auVar150._0_4_ - auVar140._0_4_ * auVar23._0_4_));
        auVar23 = vshufps_avx(auVar79,auVar79,0);
        auVar79 = vdivps_avx(auVar118,auVar23);
        auVar23 = vdivps_avx(auVar107,auVar23);
        auVar107 = vinsertps_avx(auVar259,auVar314,0x1c);
        auVar140 = vinsertps_avx(auVar270,auVar325,0x1c);
        auVar108 = vinsertps_avx(auVar314,auVar259,0x4c);
        auVar235 = vinsertps_avx(auVar325,auVar270,0x4c);
        auVar150 = vmovsldup_avx(auVar79);
        auVar271._0_4_ = auVar107._0_4_ * auVar150._0_4_;
        auVar271._4_4_ = auVar107._4_4_ * auVar150._4_4_;
        auVar271._8_4_ = auVar107._8_4_ * auVar150._8_4_;
        auVar271._12_4_ = auVar107._12_4_ * auVar150._12_4_;
        auVar113._0_4_ = auVar150._0_4_ * auVar140._0_4_;
        auVar113._4_4_ = auVar150._4_4_ * auVar140._4_4_;
        auVar113._8_4_ = auVar150._8_4_ * auVar140._8_4_;
        auVar113._12_4_ = auVar150._12_4_ * auVar140._12_4_;
        auVar118 = vminps_avx(auVar271,auVar113);
        auVar150 = vmaxps_avx(auVar113,auVar271);
        auVar9 = vmovsldup_avx(auVar23);
        auVar326._0_4_ = auVar9._0_4_ * auVar108._0_4_;
        auVar326._4_4_ = auVar9._4_4_ * auVar108._4_4_;
        auVar326._8_4_ = auVar9._8_4_ * auVar108._8_4_;
        auVar326._12_4_ = auVar9._12_4_ * auVar108._12_4_;
        auVar272._0_4_ = auVar9._0_4_ * auVar235._0_4_;
        auVar272._4_4_ = auVar9._4_4_ * auVar235._4_4_;
        auVar272._8_4_ = auVar9._8_4_ * auVar235._8_4_;
        auVar272._12_4_ = auVar9._12_4_ * auVar235._12_4_;
        auVar9 = vminps_avx(auVar326,auVar272);
        auVar176._0_4_ = auVar118._0_4_ + auVar9._0_4_;
        auVar176._4_4_ = auVar118._4_4_ + auVar9._4_4_;
        auVar176._8_4_ = auVar118._8_4_ + auVar9._8_4_;
        auVar176._12_4_ = auVar118._12_4_ + auVar9._12_4_;
        auVar118 = vmaxps_avx(auVar272,auVar326);
        auVar9 = vsubps_avx(auVar280,auVar162);
        auVar100 = vsubps_avx(auVar291,auVar162);
        auVar114._0_4_ = auVar118._0_4_ + auVar150._0_4_;
        auVar114._4_4_ = auVar118._4_4_ + auVar150._4_4_;
        auVar114._8_4_ = auVar118._8_4_ + auVar150._8_4_;
        auVar114._12_4_ = auVar118._12_4_ + auVar150._12_4_;
        auVar292._8_8_ = 0x3f800000;
        auVar292._0_8_ = 0x3f800000;
        auVar150 = vsubps_avx(auVar292,auVar114);
        auVar118 = vsubps_avx(auVar292,auVar176);
        fVar215 = auVar9._0_4_;
        auVar293._0_4_ = fVar215 * auVar150._0_4_;
        fVar236 = auVar9._4_4_;
        auVar293._4_4_ = fVar236 * auVar150._4_4_;
        fVar187 = auVar9._8_4_;
        auVar293._8_4_ = fVar187 * auVar150._8_4_;
        fVar188 = auVar9._12_4_;
        auVar293._12_4_ = fVar188 * auVar150._12_4_;
        fVar213 = auVar100._0_4_;
        auVar115._0_4_ = fVar213 * auVar150._0_4_;
        fVar233 = auVar100._4_4_;
        auVar115._4_4_ = fVar233 * auVar150._4_4_;
        fVar214 = auVar100._8_4_;
        auVar115._8_4_ = fVar214 * auVar150._8_4_;
        fVar234 = auVar100._12_4_;
        auVar115._12_4_ = fVar234 * auVar150._12_4_;
        auVar315._0_4_ = fVar215 * auVar118._0_4_;
        auVar315._4_4_ = fVar236 * auVar118._4_4_;
        auVar315._8_4_ = fVar187 * auVar118._8_4_;
        auVar315._12_4_ = fVar188 * auVar118._12_4_;
        auVar177._0_4_ = fVar213 * auVar118._0_4_;
        auVar177._4_4_ = fVar233 * auVar118._4_4_;
        auVar177._8_4_ = fVar214 * auVar118._8_4_;
        auVar177._12_4_ = fVar234 * auVar118._12_4_;
        auVar150 = vminps_avx(auVar293,auVar315);
        auVar118 = vminps_avx(auVar115,auVar177);
        auVar9 = vminps_avx(auVar150,auVar118);
        auVar150 = vmaxps_avx(auVar315,auVar293);
        auVar118 = vmaxps_avx(auVar177,auVar115);
        auVar100 = vshufps_avx(auVar162,auVar162,0x54);
        auVar118 = vmaxps_avx(auVar118,auVar150);
        auVar101 = vshufps_avx(auVar303,auVar303,0);
        auVar132 = vshufps_avx(auVar303,auVar303,0x55);
        auVar150 = vhaddps_avx(auVar9,auVar9);
        auVar118 = vhaddps_avx(auVar118,auVar118);
        auVar178._0_4_ = auVar132._0_4_ * auVar23._0_4_ + auVar101._0_4_ * auVar79._0_4_;
        auVar178._4_4_ = auVar132._4_4_ * auVar23._4_4_ + auVar101._4_4_ * auVar79._4_4_;
        auVar178._8_4_ = auVar132._8_4_ * auVar23._8_4_ + auVar101._8_4_ * auVar79._8_4_;
        auVar178._12_4_ = auVar132._12_4_ * auVar23._12_4_ + auVar101._12_4_ * auVar79._12_4_;
        auVar9 = vsubps_avx(auVar100,auVar178);
        fVar212 = auVar9._0_4_ + auVar150._0_4_;
        fVar232 = auVar9._0_4_ + auVar118._0_4_;
        auVar150 = vmaxss_avx(ZEXT416((uint)fVar231),ZEXT416((uint)fVar212));
        auVar118 = vminss_avx(ZEXT416((uint)fVar232),ZEXT416((uint)fVar217));
      } while (auVar118._0_4_ < auVar150._0_4_);
      auVar150 = vmovshdup_avx(auVar79);
      auVar179._0_4_ = auVar107._0_4_ * auVar150._0_4_;
      auVar179._4_4_ = auVar107._4_4_ * auVar150._4_4_;
      auVar179._8_4_ = auVar107._8_4_ * auVar150._8_4_;
      auVar179._12_4_ = auVar107._12_4_ * auVar150._12_4_;
      auVar116._0_4_ = auVar150._0_4_ * auVar140._0_4_;
      auVar116._4_4_ = auVar150._4_4_ * auVar140._4_4_;
      auVar116._8_4_ = auVar150._8_4_ * auVar140._8_4_;
      auVar116._12_4_ = auVar150._12_4_ * auVar140._12_4_;
      auVar118 = vminps_avx(auVar179,auVar116);
      auVar150 = vmaxps_avx(auVar116,auVar179);
      auVar107 = vmovshdup_avx(auVar23);
      auVar85._0_4_ = auVar107._0_4_ * auVar108._0_4_;
      auVar85._4_4_ = auVar107._4_4_ * auVar108._4_4_;
      auVar85._8_4_ = auVar107._8_4_ * auVar108._8_4_;
      auVar85._12_4_ = auVar107._12_4_ * auVar108._12_4_;
      auVar180._0_4_ = auVar235._0_4_ * auVar107._0_4_;
      auVar180._4_4_ = auVar235._4_4_ * auVar107._4_4_;
      auVar180._8_4_ = auVar235._8_4_ * auVar107._8_4_;
      auVar180._12_4_ = auVar235._12_4_ * auVar107._12_4_;
      auVar107 = vminps_avx(auVar85,auVar180);
      auVar148._0_4_ = auVar118._0_4_ + auVar107._0_4_;
      auVar148._4_4_ = auVar118._4_4_ + auVar107._4_4_;
      auVar148._8_4_ = auVar118._8_4_ + auVar107._8_4_;
      auVar148._12_4_ = auVar118._12_4_ + auVar107._12_4_;
      auVar118 = vmaxps_avx(auVar180,auVar85);
      auVar86._0_4_ = auVar150._0_4_ + auVar118._0_4_;
      auVar86._4_4_ = auVar150._4_4_ + auVar118._4_4_;
      auVar86._8_4_ = auVar150._8_4_ + auVar118._8_4_;
      auVar86._12_4_ = auVar150._12_4_ + auVar118._12_4_;
      auVar150 = vsubps_avx(auVar225,auVar86);
      auVar118 = vsubps_avx(auVar225,auVar148);
      auVar149._0_4_ = fVar215 * auVar150._0_4_;
      auVar149._4_4_ = fVar236 * auVar150._4_4_;
      auVar149._8_4_ = fVar187 * auVar150._8_4_;
      auVar149._12_4_ = fVar188 * auVar150._12_4_;
      auVar181._0_4_ = fVar215 * auVar118._0_4_;
      auVar181._4_4_ = fVar236 * auVar118._4_4_;
      auVar181._8_4_ = fVar187 * auVar118._8_4_;
      auVar181._12_4_ = fVar188 * auVar118._12_4_;
      auVar87._0_4_ = fVar213 * auVar150._0_4_;
      auVar87._4_4_ = fVar233 * auVar150._4_4_;
      auVar87._8_4_ = fVar214 * auVar150._8_4_;
      auVar87._12_4_ = fVar234 * auVar150._12_4_;
      auVar117._0_4_ = fVar213 * auVar118._0_4_;
      auVar117._4_4_ = fVar233 * auVar118._4_4_;
      auVar117._8_4_ = fVar214 * auVar118._8_4_;
      auVar117._12_4_ = fVar234 * auVar118._12_4_;
      auVar150 = vminps_avx(auVar149,auVar181);
      auVar118 = vminps_avx(auVar87,auVar117);
      auVar150 = vminps_avx(auVar150,auVar118);
      auVar118 = vmaxps_avx(auVar181,auVar149);
      auVar107 = vmaxps_avx(auVar117,auVar87);
      auVar150 = vhaddps_avx(auVar150,auVar150);
      auVar118 = vmaxps_avx(auVar107,auVar118);
      auVar118 = vhaddps_avx(auVar118,auVar118);
      auVar107 = vmovshdup_avx(auVar9);
      auVar140 = ZEXT416((uint)(auVar107._0_4_ + auVar150._0_4_));
      auVar150 = vmaxss_avx(auVar227,auVar140);
      auVar107 = ZEXT416((uint)(auVar107._0_4_ + auVar118._0_4_));
      auVar118 = vminss_avx(auVar107,auVar74);
      auVar316._8_4_ = 0x7fffffff;
      auVar316._0_8_ = 0x7fffffff7fffffff;
      auVar316._12_4_ = 0x7fffffff;
    } while (auVar118._0_4_ < auVar150._0_4_);
    uVar70 = 0;
    if ((fVar231 < fVar212) && (fVar232 < fVar217)) {
      auVar150 = vcmpps_avx(auVar107,auVar74,1);
      auVar118 = vcmpps_avx(auVar227,auVar140,1);
      auVar150 = vandps_avx(auVar118,auVar150);
      uVar70 = auVar150._0_4_;
    }
    if ((3 < uVar69 || fVar211 < 0.001) || (uVar70 & 1) != 0) {
      lVar71 = 200;
      do {
        fVar211 = auVar9._0_4_;
        fVar217 = 1.0 - fVar211;
        auVar150 = ZEXT416((uint)(fVar217 * fVar217 * fVar217));
        auVar150 = vshufps_avx(auVar150,auVar150,0);
        auVar118 = ZEXT416((uint)(fVar211 * 3.0 * fVar217 * fVar217));
        auVar118 = vshufps_avx(auVar118,auVar118,0);
        auVar107 = ZEXT416((uint)(fVar217 * fVar211 * fVar211 * 3.0));
        auVar107 = vshufps_avx(auVar107,auVar107,0);
        auVar140 = ZEXT416((uint)(fVar211 * fVar211 * fVar211));
        auVar140 = vshufps_avx(auVar140,auVar140,0);
        fVar217 = local_548 * auVar150._0_4_ +
                  local_4b8 * auVar118._0_4_ +
                  (float)local_408._0_4_ * auVar140._0_4_ + local_4c8 * auVar107._0_4_;
        fVar211 = fStack_544 * auVar150._4_4_ +
                  fStack_4b4 * auVar118._4_4_ +
                  (float)local_408._4_4_ * auVar140._4_4_ + fStack_4c4 * auVar107._4_4_;
        auVar88._0_8_ = CONCAT44(fVar211,fVar217);
        auVar88._8_4_ =
             fStack_540 * auVar150._8_4_ +
             fStack_4b0 * auVar118._8_4_ + fStack_400 * auVar140._8_4_ + fStack_4c0 * auVar107._8_4_
        ;
        auVar88._12_4_ =
             fStack_53c * auVar150._12_4_ +
             fStack_4ac * auVar118._12_4_ +
             fStack_3fc * auVar140._12_4_ + fStack_4bc * auVar107._12_4_;
        auVar119._8_8_ = auVar88._0_8_;
        auVar119._0_8_ = auVar88._0_8_;
        auVar118 = vshufpd_avx(auVar88,auVar88,1);
        auVar150 = vmovshdup_avx(auVar9);
        auVar118 = vsubps_avx(auVar118,auVar119);
        auVar89._0_4_ = auVar150._0_4_ * auVar118._0_4_ + fVar217;
        auVar89._4_4_ = auVar150._4_4_ * auVar118._4_4_ + fVar211;
        auVar89._8_4_ = auVar150._8_4_ * auVar118._8_4_ + fVar217;
        auVar89._12_4_ = auVar150._12_4_ * auVar118._12_4_ + fVar211;
        auVar150 = vshufps_avx(auVar89,auVar89,0);
        auVar118 = vshufps_avx(auVar89,auVar89,0x55);
        auVar120._0_4_ = auVar79._0_4_ * auVar150._0_4_ + auVar23._0_4_ * auVar118._0_4_;
        auVar120._4_4_ = auVar79._4_4_ * auVar150._4_4_ + auVar23._4_4_ * auVar118._4_4_;
        auVar120._8_4_ = auVar79._8_4_ * auVar150._8_4_ + auVar23._8_4_ * auVar118._8_4_;
        auVar120._12_4_ = auVar79._12_4_ * auVar150._12_4_ + auVar23._12_4_ * auVar118._12_4_;
        auVar9 = vsubps_avx(auVar9,auVar120);
        auVar150 = vandps_avx(auVar316,auVar89);
        auVar118 = vshufps_avx(auVar150,auVar150,0xf5);
        auVar150 = vmaxss_avx(auVar118,auVar150);
        if (auVar150._0_4_ < (float)local_418._0_4_) {
          fVar217 = auVar9._0_4_;
          if ((0.0 <= fVar217) && (fVar217 <= 1.0)) {
            auVar79 = vmovshdup_avx(auVar9);
            fVar211 = auVar79._0_4_;
            if ((0.0 <= fVar211) && (fVar211 <= 1.0)) {
              auVar79 = vinsertps_avx(ZEXT416((uint)(pLVar72->vx).field_0.m128[2]),
                                      ZEXT416((uint)(pLVar72->vy).field_0.m128[2]),0x1c);
              auVar235 = vinsertps_avx(auVar79,ZEXT416((uint)(pLVar72->vz).field_0.m128[2]),0x28);
              auVar79 = vdpps_avx(auVar235,local_2a8,0x7f);
              auVar23 = vdpps_avx(auVar235,local_2b8,0x7f);
              auVar150 = vdpps_avx(auVar235,local_2e8,0x7f);
              auVar118 = vdpps_avx(auVar235,local_2f8,0x7f);
              auVar107 = vdpps_avx(auVar235,local_308,0x7f);
              auVar140 = vdpps_avx(auVar235,local_318,0x7f);
              fVar233 = 1.0 - fVar211;
              auVar108 = vdpps_avx(auVar235,local_2c8,0x7f);
              auVar235 = vdpps_avx(auVar235,local_2d8,0x7f);
              fVar214 = 1.0 - fVar217;
              fVar231 = auVar9._4_4_;
              fVar212 = auVar9._8_4_;
              fVar232 = auVar9._12_4_;
              fVar213 = fVar214 * fVar217 * fVar217 * 3.0;
              auVar206._0_4_ = fVar217 * fVar217 * fVar217;
              auVar206._4_4_ = fVar231 * fVar231 * fVar231;
              auVar206._8_4_ = fVar212 * fVar212 * fVar212;
              auVar206._12_4_ = fVar232 * fVar232 * fVar232;
              fVar231 = fVar217 * 3.0 * fVar214 * fVar214;
              fVar212 = fVar214 * fVar214 * fVar214;
              fVar217 = (fVar233 * auVar79._0_4_ + fVar211 * auVar150._0_4_) * fVar212 +
                        (fVar233 * auVar23._0_4_ + fVar211 * auVar118._0_4_) * fVar231 +
                        fVar213 * (fVar233 * auVar108._0_4_ + fVar211 * auVar107._0_4_) +
                        auVar206._0_4_ * (auVar140._0_4_ * fVar211 + fVar233 * auVar235._0_4_);
              if ((fVar192 <= fVar217) &&
                 (fVar211 = *(float *)(ray + k * 4 + 0x80), fVar217 <= fVar211)) {
                pGVar11 = (context->scene->geometries).items[uVar67].ptr;
                if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  bVar73 = false;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar73 = true, pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_1e8 = vshufps_avx(auVar9,auVar9,0x55);
                  auVar260._8_4_ = 0x3f800000;
                  auVar260._0_8_ = 0x3f8000003f800000;
                  auVar260._12_4_ = 0x3f800000;
                  auVar79 = vsubps_avx(auVar260,local_1e8);
                  fVar232 = local_1e8._0_4_;
                  fVar233 = local_1e8._4_4_;
                  fVar234 = local_1e8._8_4_;
                  fVar215 = local_1e8._12_4_;
                  fVar236 = auVar79._0_4_;
                  fVar187 = auVar79._4_4_;
                  fVar188 = auVar79._8_4_;
                  fVar189 = auVar79._12_4_;
                  auVar273._0_4_ =
                       fVar232 * (float)local_438._0_4_ + fVar236 * (float)local_428._0_4_;
                  auVar273._4_4_ =
                       fVar233 * (float)local_438._4_4_ + fVar187 * (float)local_428._4_4_;
                  auVar273._8_4_ = fVar234 * fStack_430 + fVar188 * fStack_420;
                  auVar273._12_4_ = fVar215 * fStack_42c + fVar189 * fStack_41c;
                  auVar281._0_4_ =
                       fVar232 * (float)local_488._0_4_ + fVar236 * (float)local_468._0_4_;
                  auVar281._4_4_ =
                       fVar233 * (float)local_488._4_4_ + fVar187 * (float)local_468._4_4_;
                  auVar281._8_4_ = fVar234 * fStack_480 + fVar188 * fStack_460;
                  auVar281._12_4_ = fVar215 * fStack_47c + fVar189 * fStack_45c;
                  auVar294._0_4_ =
                       fVar232 * (float)local_338._0_4_ + fVar236 * (float)local_478._0_4_;
                  auVar294._4_4_ =
                       fVar233 * (float)local_338._4_4_ + fVar187 * (float)local_478._4_4_;
                  auVar294._8_4_ = fVar234 * fStack_330 + fVar188 * fStack_470;
                  auVar294._12_4_ = fVar215 * fStack_32c + fVar189 * fStack_46c;
                  auVar261._0_4_ =
                       fVar232 * (float)local_458._0_4_ + fVar236 * (float)local_448._0_4_;
                  auVar261._4_4_ =
                       fVar233 * (float)local_458._4_4_ + fVar187 * (float)local_448._4_4_;
                  auVar261._8_4_ = fVar234 * fStack_450 + fVar188 * fStack_440;
                  auVar261._12_4_ = fVar215 * fStack_44c + fVar189 * fStack_43c;
                  auVar118 = vsubps_avx(auVar281,auVar273);
                  auVar107 = vsubps_avx(auVar294,auVar281);
                  auVar140 = vsubps_avx(auVar261,auVar294);
                  local_1f8 = vshufps_avx(auVar9,auVar9,0);
                  fVar232 = local_1f8._0_4_;
                  fVar234 = local_1f8._4_4_;
                  fVar215 = local_1f8._8_4_;
                  fVar187 = local_1f8._12_4_;
                  auVar79 = vshufps_avx(ZEXT416((uint)fVar214),ZEXT416((uint)fVar214),0);
                  fVar233 = auVar79._0_4_;
                  fVar214 = auVar79._4_4_;
                  fVar236 = auVar79._8_4_;
                  fVar188 = auVar79._12_4_;
                  auVar79 = vshufps_avx(auVar206,auVar206,0);
                  auVar23 = vshufps_avx(ZEXT416((uint)fVar213),ZEXT416((uint)fVar213),0);
                  auVar150 = vshufps_avx(ZEXT416((uint)fVar231),ZEXT416((uint)fVar231),0);
                  auVar182._0_4_ =
                       ((auVar107._0_4_ * fVar233 + auVar140._0_4_ * fVar232) * fVar232 +
                       (auVar118._0_4_ * fVar233 + auVar107._0_4_ * fVar232) * fVar233) * 3.0;
                  auVar182._4_4_ =
                       ((auVar107._4_4_ * fVar214 + auVar140._4_4_ * fVar234) * fVar234 +
                       (auVar118._4_4_ * fVar214 + auVar107._4_4_ * fVar234) * fVar214) * 3.0;
                  auVar182._8_4_ =
                       ((auVar107._8_4_ * fVar236 + auVar140._8_4_ * fVar215) * fVar215 +
                       (auVar118._8_4_ * fVar236 + auVar107._8_4_ * fVar215) * fVar236) * 3.0;
                  auVar182._12_4_ =
                       ((auVar107._12_4_ * fVar188 + auVar140._12_4_ * fVar187) * fVar187 +
                       (auVar118._12_4_ * fVar188 + auVar107._12_4_ * fVar187) * fVar188) * 3.0;
                  auVar118 = vshufps_avx(ZEXT416((uint)fVar212),ZEXT416((uint)fVar212),0);
                  auVar121._0_4_ =
                       auVar118._0_4_ * (float)local_368._0_4_ +
                       auVar150._0_4_ * (float)local_378._0_4_ +
                       auVar79._0_4_ * (float)local_398._0_4_ +
                       auVar23._0_4_ * (float)local_388._0_4_;
                  auVar121._4_4_ =
                       auVar118._4_4_ * (float)local_368._4_4_ +
                       auVar150._4_4_ * (float)local_378._4_4_ +
                       auVar79._4_4_ * (float)local_398._4_4_ +
                       auVar23._4_4_ * (float)local_388._4_4_;
                  auVar121._8_4_ =
                       auVar118._8_4_ * fStack_360 +
                       auVar150._8_4_ * fStack_370 +
                       auVar79._8_4_ * fStack_390 + auVar23._8_4_ * fStack_380;
                  auVar121._12_4_ =
                       auVar118._12_4_ * fStack_35c +
                       auVar150._12_4_ * fStack_36c +
                       auVar79._12_4_ * fStack_38c + auVar23._12_4_ * fStack_37c;
                  auVar79 = vshufps_avx(auVar182,auVar182,0xc9);
                  auVar151._0_4_ = auVar121._0_4_ * auVar79._0_4_;
                  auVar151._4_4_ = auVar121._4_4_ * auVar79._4_4_;
                  auVar151._8_4_ = auVar121._8_4_ * auVar79._8_4_;
                  auVar151._12_4_ = auVar121._12_4_ * auVar79._12_4_;
                  auVar79 = vshufps_avx(auVar121,auVar121,0xc9);
                  auVar122._0_4_ = auVar182._0_4_ * auVar79._0_4_;
                  auVar122._4_4_ = auVar182._4_4_ * auVar79._4_4_;
                  auVar122._8_4_ = auVar182._8_4_ * auVar79._8_4_;
                  auVar122._12_4_ = auVar182._12_4_ * auVar79._12_4_;
                  auVar23 = vsubps_avx(auVar122,auVar151);
                  auVar79 = vshufps_avx(auVar23,auVar23,0x55);
                  local_228[0] = (RTCHitN)auVar79[0];
                  local_228[1] = (RTCHitN)auVar79[1];
                  local_228[2] = (RTCHitN)auVar79[2];
                  local_228[3] = (RTCHitN)auVar79[3];
                  local_228[4] = (RTCHitN)auVar79[4];
                  local_228[5] = (RTCHitN)auVar79[5];
                  local_228[6] = (RTCHitN)auVar79[6];
                  local_228[7] = (RTCHitN)auVar79[7];
                  local_228[8] = (RTCHitN)auVar79[8];
                  local_228[9] = (RTCHitN)auVar79[9];
                  local_228[10] = (RTCHitN)auVar79[10];
                  local_228[0xb] = (RTCHitN)auVar79[0xb];
                  local_228[0xc] = (RTCHitN)auVar79[0xc];
                  local_228[0xd] = (RTCHitN)auVar79[0xd];
                  local_228[0xe] = (RTCHitN)auVar79[0xe];
                  local_228[0xf] = (RTCHitN)auVar79[0xf];
                  local_218 = vshufps_avx(auVar23,auVar23,0xaa);
                  local_208 = vshufps_avx(auVar23,auVar23,0);
                  local_1d8 = local_358._0_8_;
                  uStack_1d0 = local_358._8_8_;
                  local_1c8 = local_348._0_8_;
                  uStack_1c0 = local_348._8_8_;
                  vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                  uStack_1b4 = context->user->instID[0];
                  local_1b8 = uStack_1b4;
                  uStack_1b0 = uStack_1b4;
                  uStack_1ac = uStack_1b4;
                  uStack_1a8 = context->user->instPrimID[0];
                  uStack_1a4 = uStack_1a8;
                  uStack_1a0 = uStack_1a8;
                  uStack_19c = uStack_1a8;
                  *(float *)(ray + k * 4 + 0x80) = fVar217;
                  local_4a8 = *local_498;
                  local_3c8.valid = (int *)local_4a8;
                  local_3c8.geometryUserPtr = pGVar11->userPtr;
                  local_3c8.context = context->user;
                  local_3c8.ray = (RTCRayN *)ray;
                  local_3c8.hit = local_228;
                  local_3c8.N = 4;
                  if (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar11->occlusionFilterN)(&local_3c8);
                  }
                  if (local_4a8 == (undefined1  [16])0x0) {
                    auVar79 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                    auVar79 = auVar79 ^ _DAT_01f7ae20;
                  }
                  else {
                    p_Var14 = context->args->filter;
                    if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var14)(&local_3c8);
                    }
                    auVar23 = vpcmpeqd_avx(local_4a8,ZEXT816(0) << 0x40);
                    auVar79 = auVar23 ^ _DAT_01f7ae20;
                    auVar152._8_4_ = 0xff800000;
                    auVar152._0_8_ = 0xff800000ff800000;
                    auVar152._12_4_ = 0xff800000;
                    auVar23 = vblendvps_avx(auVar152,*(undefined1 (*) [16])(local_3c8.ray + 0x80),
                                            auVar23);
                    *(undefined1 (*) [16])(local_3c8.ray + 0x80) = auVar23;
                  }
                  auVar123._8_8_ = 0x100000001;
                  auVar123._0_8_ = 0x100000001;
                  bVar73 = (auVar123 & auVar79) != (undefined1  [16])0x0;
                  if (!bVar73) {
                    *(float *)(ray + k * 4 + 0x80) = fVar211;
                  }
                }
                bVar64 = (bool)(bVar64 | bVar73);
                pLVar72 = local_490;
              }
            }
          }
          break;
        }
        lVar71 = lVar71 + -1;
      } while (lVar71 != 0);
      goto LAB_0106771e;
    }
    auVar79 = vinsertps_avx(ZEXT416((uint)fVar231),ZEXT416((uint)fVar217),0x10);
    auVar285 = ZEXT1664(auVar79);
    auVar277 = ZEXT1664(auVar227);
  } while( true );
}

Assistant:

static __forceinline bool occluded_hn(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }